

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx::CurveGeometryInterface,_embree::BezierCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  BufferView<embree::Vec3fx> *pBVar5;
  BufferView<embree::Vec3fa> *pBVar6;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  undefined1 auVar10 [32];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  undefined4 uVar33;
  bool bVar34;
  float fVar35;
  float fVar53;
  float fVar54;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  float fVar55;
  float fVar56;
  float fVar69;
  float fVar70;
  Vec3fa n1;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  float fVar71;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  float fVar92;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  float fVar100;
  float fVar101;
  float fVar102;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  float fVar118;
  float fVar127;
  float fVar128;
  float fVar129;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  vfloat4 b0;
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [64];
  float fVar161;
  float fVar162;
  vfloat4 a0_2;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar163;
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [64];
  float pp;
  float fVar164;
  float fVar178;
  float fVar179;
  float fVar180;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  float fVar181;
  float fVar182;
  float fVar186;
  float fVar188;
  __m128 a;
  float fVar190;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  float fVar187;
  float fVar189;
  undefined1 auVar185 [32];
  float fVar191;
  float fVar192;
  float fVar194;
  float fVar195;
  float fVar196;
  float fVar197;
  float fVar198;
  float fVar199;
  float fVar200;
  undefined1 auVar193 [32];
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  float fVar210;
  float fVar211;
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  float fVar215;
  float fVar216;
  float fVar217;
  vfloat4 a0;
  undefined1 auVar212 [16];
  float fVar218;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  float fVar219;
  float fVar221;
  float fVar222;
  Vec3fa n0;
  float fVar223;
  undefined1 auVar220 [16];
  undefined1 auVar224 [16];
  float fVar227;
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  size_t local_288;
  size_t local_270;
  undefined1 local_268 [16];
  undefined1 local_258 [16];
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 auVar52 [64];
  undefined1 auVar91 [64];
  
  auVar36._8_4_ = 0x7f800000;
  auVar36._0_8_ = 0x7f8000007f800000;
  auVar36._12_4_ = 0x7f800000;
  auVar52 = ZEXT1664(auVar36);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
   m128 = auVar36;
  auVar73._8_4_ = 0xff800000;
  auVar73._0_8_ = 0xff800000ff800000;
  auVar73._12_4_ = 0xff800000;
  auVar91 = ZEXT1664(auVar73);
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = auVar73;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
   m128 = auVar36;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
   m128 = auVar73;
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar31 = r->_begin;
  local_288 = __return_storage_ptr__->end;
  local_268 = auVar36;
  local_258 = auVar73;
  if (uVar31 < r->_end) {
    auVar149 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    auVar160 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    local_270 = k;
    do {
      uVar4 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                  super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_CurveGeometryInterface<embree::BezierCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar31);
      uVar27 = (ulong)uVar4;
      uVar32 = (ulong)(uVar4 + 3);
      pBVar5 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
               vertices.items;
      if (uVar32 < (pBVar5->super_RawBufferView).num) {
        uVar25 = (ulong)((this->super_CurveGeometryInterface<embree::BezierCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1);
        pBVar6 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                 normals.items;
        fVar56 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                 maxRadiusScale;
        lVar29 = 0x10;
        bVar34 = false;
        uVar24 = 0;
        do {
          lVar30 = *(long *)((long)pBVar5 + lVar29 + -0x10);
          lVar7 = *(long *)((long)&(pBVar5->super_RawBufferView).ptr_ofs + lVar29);
          lVar26 = lVar7 * (ulong)(uVar4 + 1);
          lVar28 = lVar7 * (ulong)(uVar4 + 2);
          auVar36 = vinsertps_avx(ZEXT416(*(uint *)(lVar30 + 0xc + lVar7 * uVar27)),
                                  ZEXT416(*(uint *)(lVar30 + 0xc + lVar26)),0x10);
          auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(lVar30 + 0xc + lVar28)),0x20);
          auVar36 = vinsertps_avx(auVar36,ZEXT416(*(uint *)(lVar30 + 0xc + lVar7 * uVar32)),0x30);
          auVar57._8_4_ = 0x7fffffff;
          auVar57._0_8_ = 0x7fffffff7fffffff;
          auVar57._12_4_ = 0x7fffffff;
          auVar36 = vandps_avx(auVar36,auVar57);
          auVar73 = auVar149._0_16_;
          auVar36 = vcmpps_avx(auVar36,auVar73,5);
          if ((((auVar36 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar36 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar36 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar36[0xf] < '\0') break;
          auVar36 = *(undefined1 (*) [16])(lVar30 + lVar7 * uVar27);
          auVar150 = auVar160._0_16_;
          auVar57 = vcmpps_avx(auVar36,auVar150,6);
          auVar58 = vcmpps_avx(auVar36,auVar73,1);
          auVar57 = vandps_avx(auVar57,auVar58);
          uVar33 = vmovmskps_avx(auVar57);
          if ((~(byte)uVar33 & 7) != 0) break;
          auVar57 = *(undefined1 (*) [16])(lVar30 + lVar26);
          auVar58 = vcmpps_avx(auVar57,auVar150,6);
          auVar37 = vcmpps_avx(auVar57,auVar73,1);
          auVar58 = vandps_avx(auVar58,auVar37);
          uVar33 = vmovmskps_avx(auVar58);
          if ((~(byte)uVar33 & 7) != 0) break;
          auVar58 = *(undefined1 (*) [16])(lVar30 + lVar28);
          auVar37 = vcmpps_avx(auVar58,auVar150,6);
          auVar38 = vcmpps_avx(auVar58,auVar73,1);
          auVar37 = vandps_avx(auVar37,auVar38);
          uVar33 = vmovmskps_avx(auVar37);
          if ((~(byte)uVar33 & 7) != 0) break;
          auVar37 = *(undefined1 (*) [16])(lVar30 + lVar7 * uVar32);
          auVar38 = vcmpps_avx(auVar37,auVar150,6);
          auVar60 = vcmpps_avx(auVar37,auVar73,1);
          auVar38 = vandps_avx(auVar38,auVar60);
          uVar33 = vmovmskps_avx(auVar38);
          if ((~(byte)uVar33 & 7) != 0) break;
          lVar30 = *(long *)((long)pBVar6 + lVar29 + -0x10);
          lVar7 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar29);
          auVar38 = *(undefined1 (*) [16])(lVar30 + lVar7 * uVar27);
          auVar60 = vcmpps_avx(auVar38,auVar150,6);
          auVar79 = vcmpps_avx(auVar38,auVar73,1);
          auVar60 = vandps_avx(auVar60,auVar79);
          uVar33 = vmovmskps_avx(auVar60);
          if ((~(byte)uVar33 & 7) != 0) break;
          auVar60 = *(undefined1 (*) [16])(lVar30 + lVar7 * (ulong)(uVar4 + 1));
          auVar150 = vcmpps_avx(auVar60,auVar150,6);
          auVar73 = vcmpps_avx(auVar60,auVar73,1);
          auVar73 = vandps_avx(auVar150,auVar73);
          uVar33 = vmovmskps_avx(auVar73);
          if ((~(byte)uVar33 & 7) != 0) break;
          auVar73 = vshufps_avx(auVar36,auVar36,0xff);
          auVar36 = vinsertps_avx(auVar36,ZEXT416((uint)(auVar73._0_4_ * fVar56)),0x30);
          auVar73 = vshufps_avx(auVar57,auVar57,0xff);
          auVar73 = vinsertps_avx(auVar57,ZEXT416((uint)(auVar73._0_4_ * fVar56)),0x30);
          auVar57 = vshufps_avx(auVar58,auVar58,0xff);
          auVar57 = vinsertps_avx(auVar58,ZEXT416((uint)(auVar57._0_4_ * fVar56)),0x30);
          auVar58 = vshufps_avx(auVar37,auVar37,0xff);
          auVar58 = vinsertps_avx(auVar37,ZEXT416((uint)(auVar58._0_4_ * fVar56)),0x30);
          pfVar1 = (float *)(lVar30 + lVar7 * (ulong)(uVar4 + 2));
          pfVar2 = (float *)(lVar30 + lVar7 * uVar32);
          fVar55 = *pfVar2;
          fVar69 = pfVar2[1];
          fVar70 = pfVar2[2];
          fVar71 = pfVar2[3];
          fVar35 = auVar58._0_4_;
          fVar53 = auVar58._4_4_;
          fVar54 = auVar58._8_4_;
          fVar72 = auVar58._12_4_;
          fVar164 = auVar57._0_4_ * 0.0;
          fVar178 = auVar57._4_4_ * 0.0;
          fVar179 = auVar57._8_4_ * 0.0;
          fVar180 = auVar57._12_4_ * 0.0;
          fVar118 = fVar164 + fVar35 * 0.0;
          fVar127 = fVar178 + fVar53 * 0.0;
          fVar128 = fVar179 + fVar54 * 0.0;
          fVar129 = fVar180 + fVar72 * 0.0;
          fVar181 = auVar73._0_4_ * 0.0;
          fVar186 = auVar73._4_4_ * 0.0;
          fVar188 = auVar73._8_4_ * 0.0;
          fVar190 = auVar73._12_4_ * 0.0;
          fVar202 = auVar36._0_4_;
          fVar92 = fVar202 + fVar181 + fVar118;
          fVar192 = auVar36._4_4_;
          fVar100 = fVar192 + fVar186 + fVar127;
          fVar195 = auVar36._8_4_;
          fVar101 = fVar195 + fVar188 + fVar128;
          fVar197 = auVar36._12_4_;
          fVar102 = fVar197 + fVar190 + fVar129;
          auVar119._0_4_ = auVar73._0_4_ * 3.0 + fVar118;
          auVar119._4_4_ = auVar73._4_4_ * 3.0 + fVar127;
          auVar119._8_4_ = auVar73._8_4_ * 3.0 + fVar128;
          auVar119._12_4_ = auVar73._12_4_ * 3.0 + fVar129;
          auVar130._0_4_ = fVar202 * 3.0;
          auVar130._4_4_ = fVar192 * 3.0;
          auVar130._8_4_ = fVar195 * 3.0;
          auVar130._12_4_ = fVar197 * 3.0;
          auVar79 = vsubps_avx(auVar119,auVar130);
          fVar191 = *pfVar1 * 0.0;
          fVar194 = pfVar1[1] * 0.0;
          fVar196 = pfVar1[2] * 0.0;
          fVar199 = pfVar1[3] * 0.0;
          fVar118 = fVar191 + fVar55 * 0.0;
          fVar127 = fVar194 + fVar69 * 0.0;
          fVar128 = fVar196 + fVar70 * 0.0;
          fVar129 = fVar199 + fVar71 * 0.0;
          fVar201 = auVar60._0_4_ * 0.0;
          fVar206 = auVar60._4_4_ * 0.0;
          fVar208 = auVar60._8_4_ * 0.0;
          fVar210 = auVar60._12_4_ * 0.0;
          fVar215 = auVar38._0_4_;
          auVar212._0_4_ = fVar215 + fVar201 + fVar118;
          fVar217 = auVar38._4_4_;
          auVar212._4_4_ = fVar217 + fVar206 + fVar127;
          fVar218 = auVar38._8_4_;
          auVar212._8_4_ = fVar218 + fVar208 + fVar128;
          fVar161 = auVar38._12_4_;
          auVar212._12_4_ = fVar161 + fVar210 + fVar129;
          auVar58._0_4_ = auVar60._0_4_ * 3.0 + fVar118;
          auVar58._4_4_ = auVar60._4_4_ * 3.0 + fVar127;
          auVar58._8_4_ = auVar60._8_4_ * 3.0 + fVar128;
          auVar58._12_4_ = auVar60._12_4_ * 3.0 + fVar129;
          auVar131._0_4_ = fVar215 * 3.0;
          auVar131._4_4_ = fVar217 * 3.0;
          auVar131._8_4_ = fVar218 * 3.0;
          auVar131._12_4_ = fVar161 * 3.0;
          auVar58 = vsubps_avx(auVar58,auVar131);
          auVar74._0_4_ = fVar202 * 0.0;
          auVar74._4_4_ = fVar192 * 0.0;
          auVar74._8_4_ = fVar195 * 0.0;
          auVar74._12_4_ = fVar197 * 0.0;
          auVar132._0_4_ = auVar74._0_4_ + fVar181 + fVar164 + fVar35;
          auVar132._4_4_ = auVar74._4_4_ + fVar186 + fVar178 + fVar53;
          auVar132._8_4_ = auVar74._8_4_ + fVar188 + fVar179 + fVar54;
          auVar132._12_4_ = auVar74._12_4_ + fVar190 + fVar180 + fVar72;
          auVar141._0_4_ = fVar35 * 3.0;
          auVar141._4_4_ = fVar53 * 3.0;
          auVar141._8_4_ = fVar54 * 3.0;
          auVar141._12_4_ = fVar72 * 3.0;
          auVar103._0_4_ = auVar57._0_4_ * 3.0;
          auVar103._4_4_ = auVar57._4_4_ * 3.0;
          auVar103._8_4_ = auVar57._8_4_ * 3.0;
          auVar103._12_4_ = auVar57._12_4_ * 3.0;
          auVar36 = vsubps_avx(auVar141,auVar103);
          auVar104._0_4_ = fVar181 + auVar36._0_4_;
          auVar104._4_4_ = fVar186 + auVar36._4_4_;
          auVar104._8_4_ = fVar188 + auVar36._8_4_;
          auVar104._12_4_ = fVar190 + auVar36._12_4_;
          auVar60 = vsubps_avx(auVar104,auVar74);
          auVar105._0_4_ = fVar215 * 0.0;
          auVar105._4_4_ = fVar217 * 0.0;
          auVar105._8_4_ = fVar218 * 0.0;
          auVar105._12_4_ = fVar161 * 0.0;
          auVar75._0_4_ = auVar105._0_4_ + fVar201 + fVar191 + fVar55;
          auVar75._4_4_ = auVar105._4_4_ + fVar206 + fVar194 + fVar69;
          auVar75._8_4_ = auVar105._8_4_ + fVar208 + fVar196 + fVar70;
          auVar75._12_4_ = auVar105._12_4_ + fVar210 + fVar199 + fVar71;
          auVar151._0_4_ = fVar55 * 3.0;
          auVar151._4_4_ = fVar69 * 3.0;
          auVar151._8_4_ = fVar70 * 3.0;
          auVar151._12_4_ = fVar71 * 3.0;
          auVar37._0_4_ = *pfVar1 * 3.0;
          auVar37._4_4_ = pfVar1[1] * 3.0;
          auVar37._8_4_ = pfVar1[2] * 3.0;
          auVar37._12_4_ = pfVar1[3] * 3.0;
          auVar36 = vsubps_avx(auVar151,auVar37);
          auVar38._0_4_ = fVar201 + auVar36._0_4_;
          auVar38._4_4_ = fVar206 + auVar36._4_4_;
          auVar38._8_4_ = fVar208 + auVar36._8_4_;
          auVar38._12_4_ = fVar210 + auVar36._12_4_;
          auVar37 = vsubps_avx(auVar38,auVar105);
          auVar36 = vshufps_avx(auVar79,auVar79,0xc9);
          auVar73 = vshufps_avx(auVar212,auVar212,0xc9);
          fVar180 = auVar79._0_4_;
          auVar106._0_4_ = fVar180 * auVar73._0_4_;
          fVar186 = auVar79._4_4_;
          auVar106._4_4_ = fVar186 * auVar73._4_4_;
          fVar190 = auVar79._8_4_;
          auVar106._8_4_ = fVar190 * auVar73._8_4_;
          fVar194 = auVar79._12_4_;
          auVar106._12_4_ = fVar194 * auVar73._12_4_;
          auVar165._0_4_ = auVar212._0_4_ * auVar36._0_4_;
          auVar165._4_4_ = auVar212._4_4_ * auVar36._4_4_;
          auVar165._8_4_ = auVar212._8_4_ * auVar36._8_4_;
          auVar165._12_4_ = auVar212._12_4_ * auVar36._12_4_;
          auVar73 = vsubps_avx(auVar165,auVar106);
          auVar57 = vshufps_avx(auVar73,auVar73,0xc9);
          auVar73 = vshufps_avx(auVar58,auVar58,0xc9);
          auVar166._0_4_ = auVar73._0_4_ * fVar180;
          auVar166._4_4_ = auVar73._4_4_ * fVar186;
          auVar166._8_4_ = auVar73._8_4_ * fVar190;
          auVar166._12_4_ = auVar73._12_4_ * fVar194;
          auVar39._0_4_ = auVar58._0_4_ * auVar36._0_4_;
          auVar39._4_4_ = auVar58._4_4_ * auVar36._4_4_;
          auVar39._8_4_ = auVar58._8_4_ * auVar36._8_4_;
          auVar39._12_4_ = auVar58._12_4_ * auVar36._12_4_;
          auVar36 = vsubps_avx(auVar39,auVar166);
          auVar58 = vshufps_avx(auVar36,auVar36,0xc9);
          auVar36 = vshufps_avx(auVar60,auVar60,0xc9);
          auVar73 = vshufps_avx(auVar75,auVar75,0xc9);
          fVar35 = auVar60._0_4_;
          auVar40._0_4_ = auVar73._0_4_ * fVar35;
          fVar53 = auVar60._4_4_;
          auVar40._4_4_ = auVar73._4_4_ * fVar53;
          fVar54 = auVar60._8_4_;
          auVar40._8_4_ = auVar73._8_4_ * fVar54;
          fVar72 = auVar60._12_4_;
          auVar40._12_4_ = auVar73._12_4_ * fVar72;
          auVar76._0_4_ = auVar75._0_4_ * auVar36._0_4_;
          auVar76._4_4_ = auVar75._4_4_ * auVar36._4_4_;
          auVar76._8_4_ = auVar75._8_4_ * auVar36._8_4_;
          auVar76._12_4_ = auVar75._12_4_ * auVar36._12_4_;
          auVar73 = vsubps_avx(auVar76,auVar40);
          auVar150 = vshufps_avx(auVar73,auVar73,0xc9);
          auVar73 = vshufps_avx(auVar37,auVar37,0xc9);
          auVar77._0_4_ = fVar35 * auVar73._0_4_;
          auVar77._4_4_ = fVar53 * auVar73._4_4_;
          auVar77._8_4_ = fVar54 * auVar73._8_4_;
          auVar77._12_4_ = fVar72 * auVar73._12_4_;
          auVar59._0_4_ = auVar37._0_4_ * auVar36._0_4_;
          auVar59._4_4_ = auVar37._4_4_ * auVar36._4_4_;
          auVar59._8_4_ = auVar37._8_4_ * auVar36._8_4_;
          auVar59._12_4_ = auVar37._12_4_ * auVar36._12_4_;
          auVar36 = vsubps_avx(auVar59,auVar77);
          auVar37 = vshufps_avx(auVar36,auVar36,0xc9);
          auVar36 = vdpps_avx(auVar57,auVar57,0x7f);
          fVar202 = auVar36._0_4_;
          auVar183._4_12_ = ZEXT812(0) << 0x20;
          auVar183._0_4_ = fVar202;
          auVar73 = vrsqrtss_avx(auVar183,auVar183);
          fVar55 = auVar73._0_4_;
          auVar73 = vdpps_avx(auVar57,auVar58,0x7f);
          auVar38 = ZEXT416((uint)(fVar55 * 1.5 - fVar202 * 0.5 * fVar55 * fVar55 * fVar55));
          auVar38 = vshufps_avx(auVar38,auVar38,0);
          fVar55 = auVar38._0_4_ * auVar57._0_4_;
          fVar69 = auVar38._4_4_ * auVar57._4_4_;
          fVar70 = auVar38._8_4_ * auVar57._8_4_;
          fVar71 = auVar38._12_4_ * auVar57._12_4_;
          auVar36 = vshufps_avx(auVar36,auVar36,0);
          auVar167._0_4_ = auVar36._0_4_ * auVar58._0_4_;
          auVar167._4_4_ = auVar36._4_4_ * auVar58._4_4_;
          auVar167._8_4_ = auVar36._8_4_ * auVar58._8_4_;
          auVar167._12_4_ = auVar36._12_4_ * auVar58._12_4_;
          auVar36 = vshufps_avx(auVar73,auVar73,0);
          auVar107._0_4_ = auVar36._0_4_ * auVar57._0_4_;
          auVar107._4_4_ = auVar36._4_4_ * auVar57._4_4_;
          auVar107._8_4_ = auVar36._8_4_ * auVar57._8_4_;
          auVar107._12_4_ = auVar36._12_4_ * auVar57._12_4_;
          auVar39 = vsubps_avx(auVar167,auVar107);
          auVar36 = vrcpss_avx(auVar183,auVar183);
          auVar36 = ZEXT416((uint)(auVar36._0_4_ * (2.0 - fVar202 * auVar36._0_4_)));
          auVar57 = vshufps_avx(auVar36,auVar36,0);
          auVar36 = vdpps_avx(auVar150,auVar150,0x7f);
          fVar202 = auVar36._0_4_;
          auVar152._4_12_ = ZEXT812(0) << 0x20;
          auVar152._0_4_ = fVar202;
          auVar73 = vrsqrtss_avx(auVar152,auVar152);
          fVar192 = auVar73._0_4_;
          auVar73 = ZEXT416((uint)(fVar192 * 1.5 - fVar202 * 0.5 * fVar192 * fVar192 * fVar192));
          auVar58 = vshufps_avx(auVar73,auVar73,0);
          fVar192 = auVar58._0_4_ * auVar150._0_4_;
          fVar195 = auVar58._4_4_ * auVar150._4_4_;
          fVar197 = auVar58._8_4_ * auVar150._8_4_;
          fVar118 = auVar58._12_4_ * auVar150._12_4_;
          auVar73 = vdpps_avx(auVar150,auVar37,0x7f);
          auVar36 = vshufps_avx(auVar36,auVar36,0);
          auVar78._0_4_ = auVar36._0_4_ * auVar37._0_4_;
          auVar78._4_4_ = auVar36._4_4_ * auVar37._4_4_;
          auVar78._8_4_ = auVar36._8_4_ * auVar37._8_4_;
          auVar78._12_4_ = auVar36._12_4_ * auVar37._12_4_;
          auVar36 = vshufps_avx(auVar73,auVar73,0);
          auVar41._0_4_ = auVar36._0_4_ * auVar150._0_4_;
          auVar41._4_4_ = auVar36._4_4_ * auVar150._4_4_;
          auVar41._8_4_ = auVar36._8_4_ * auVar150._8_4_;
          auVar41._12_4_ = auVar36._12_4_ * auVar150._12_4_;
          auVar37 = vsubps_avx(auVar78,auVar41);
          auVar36 = vrcpss_avx(auVar152,auVar152);
          auVar36 = ZEXT416((uint)((2.0 - fVar202 * auVar36._0_4_) * auVar36._0_4_));
          auVar36 = vshufps_avx(auVar36,auVar36,0);
          auVar150._4_4_ = fVar100;
          auVar150._0_4_ = fVar92;
          auVar150._8_4_ = fVar101;
          auVar150._12_4_ = fVar102;
          auVar73 = vshufps_avx(auVar150,auVar150,0xff);
          auVar168._0_4_ = auVar73._0_4_ * fVar55;
          auVar168._4_4_ = auVar73._4_4_ * fVar69;
          auVar168._8_4_ = auVar73._8_4_ * fVar70;
          auVar168._12_4_ = auVar73._12_4_ * fVar71;
          auVar40 = vsubps_avx(auVar150,auVar168);
          auVar150 = vshufps_avx(auVar79,auVar79,0xff);
          auVar42._0_4_ =
               auVar150._0_4_ * fVar55 +
               auVar73._0_4_ * auVar38._0_4_ * auVar57._0_4_ * auVar39._0_4_;
          auVar42._4_4_ =
               auVar150._4_4_ * fVar69 +
               auVar73._4_4_ * auVar38._4_4_ * auVar57._4_4_ * auVar39._4_4_;
          auVar42._8_4_ =
               auVar150._8_4_ * fVar70 +
               auVar73._8_4_ * auVar38._8_4_ * auVar57._8_4_ * auVar39._8_4_;
          auVar42._12_4_ =
               auVar150._12_4_ * fVar71 +
               auVar73._12_4_ * auVar38._12_4_ * auVar57._12_4_ * auVar39._12_4_;
          auVar150 = vsubps_avx(auVar79,auVar42);
          fVar92 = auVar168._0_4_ + fVar92;
          fVar100 = auVar168._4_4_ + fVar100;
          fVar101 = auVar168._8_4_ + fVar101;
          fVar102 = auVar168._12_4_ + fVar102;
          auVar73 = vshufps_avx(auVar132,auVar132,0xff);
          auVar169._0_4_ = fVar192 * auVar73._0_4_;
          auVar169._4_4_ = fVar195 * auVar73._4_4_;
          auVar169._8_4_ = fVar197 * auVar73._8_4_;
          auVar169._12_4_ = fVar118 * auVar73._12_4_;
          auVar38 = vsubps_avx(auVar132,auVar169);
          auVar57 = vshufps_avx(auVar60,auVar60,0xff);
          auVar108._0_4_ =
               auVar57._0_4_ * fVar192 +
               auVar58._0_4_ * auVar37._0_4_ * auVar36._0_4_ * auVar73._0_4_;
          auVar108._4_4_ =
               auVar57._4_4_ * fVar195 +
               auVar58._4_4_ * auVar37._4_4_ * auVar36._4_4_ * auVar73._4_4_;
          auVar108._8_4_ =
               auVar57._8_4_ * fVar197 +
               auVar58._8_4_ * auVar37._8_4_ * auVar36._8_4_ * auVar73._8_4_;
          auVar108._12_4_ =
               auVar57._12_4_ * fVar118 +
               auVar58._12_4_ * auVar37._12_4_ * auVar36._12_4_ * auVar73._12_4_;
          auVar36 = vsubps_avx(auVar60,auVar108);
          local_1c8._4_4_ = auVar169._4_4_ + auVar132._4_4_;
          local_1c8._0_4_ = auVar169._0_4_ + auVar132._0_4_;
          fStack_1c0 = auVar169._8_4_ + auVar132._8_4_;
          fStack_1bc = auVar169._12_4_ + auVar132._12_4_;
          auVar170._0_4_ = auVar40._0_4_ + auVar150._0_4_ * 0.33333334;
          auVar170._4_4_ = auVar40._4_4_ + auVar150._4_4_ * 0.33333334;
          auVar170._8_4_ = auVar40._8_4_ + auVar150._8_4_ * 0.33333334;
          auVar170._12_4_ = auVar40._12_4_ + auVar150._12_4_ * 0.33333334;
          auVar60._0_4_ = auVar36._0_4_ * 0.33333334;
          auVar60._4_4_ = auVar36._4_4_ * 0.33333334;
          auVar60._8_4_ = auVar36._8_4_ * 0.33333334;
          auVar60._12_4_ = auVar36._12_4_ * 0.33333334;
          auVar57 = vsubps_avx(auVar38,auVar60);
          auVar36 = vshufps_avx(auVar57,auVar57,0);
          auVar73 = vshufps_avx(auVar57,auVar57,0x55);
          auVar57 = vshufps_avx(auVar57,auVar57,0xaa);
          auVar58 = vshufps_avx(auVar38,auVar38,0);
          auVar150 = vshufps_avx(auVar38,auVar38,0x55);
          auVar37 = vshufps_avx(auVar38,auVar38,0xaa);
          fVar198 = auVar58._0_4_;
          fVar200 = auVar58._4_4_;
          fVar203 = auVar58._8_4_;
          fVar207 = auVar58._12_4_;
          fVar218 = auVar150._0_4_;
          fVar161 = auVar150._4_4_;
          fVar162 = auVar150._8_4_;
          fVar163 = auVar150._12_4_;
          fVar129 = auVar37._0_4_;
          fVar164 = auVar37._4_4_;
          fVar178 = auVar37._8_4_;
          fVar179 = auVar37._12_4_;
          fVar219 = auVar36._0_4_;
          fVar221 = auVar36._4_4_;
          fVar222 = auVar36._8_4_;
          fVar223 = auVar36._12_4_;
          fVar199 = auVar73._0_4_;
          fVar201 = auVar73._4_4_;
          fVar206 = auVar73._8_4_;
          fVar208 = auVar73._12_4_;
          fVar55 = auVar57._0_4_;
          fVar70 = auVar57._4_4_;
          fVar202 = auVar57._8_4_;
          auVar36 = vshufps_avx(auVar170,auVar170,0);
          fVar209 = auVar36._0_4_;
          fVar211 = auVar36._4_4_;
          fVar216 = auVar36._8_4_;
          auVar73 = vshufps_avx(auVar170,auVar170,0x55);
          fVar181 = auVar73._0_4_;
          fVar188 = auVar73._4_4_;
          fVar191 = auVar73._8_4_;
          fVar196 = auVar73._12_4_;
          auVar73 = vshufps_avx(auVar170,auVar170,0xaa);
          fVar69 = auVar73._0_4_;
          fVar71 = auVar73._4_4_;
          fVar192 = auVar73._8_4_;
          fVar195 = auVar73._12_4_;
          auVar73 = vshufps_avx(auVar40,auVar40,0);
          fVar182 = auVar73._0_4_;
          fVar187 = auVar73._4_4_;
          fVar189 = auVar73._8_4_;
          auVar176._0_4_ =
               fVar182 * (float)bezier_basis0._476_4_ +
               fVar209 * (float)bezier_basis0._1632_4_ +
               fVar219 * (float)bezier_basis0._2788_4_ + fVar198 * (float)bezier_basis0._3944_4_;
          auVar176._4_4_ =
               fVar187 * (float)bezier_basis0._480_4_ +
               fVar211 * (float)bezier_basis0._1636_4_ +
               fVar221 * (float)bezier_basis0._2792_4_ + fVar200 * (float)bezier_basis0._3948_4_;
          auVar176._8_4_ =
               fVar189 * (float)bezier_basis0._484_4_ +
               fVar216 * (float)bezier_basis0._1640_4_ +
               fVar222 * (float)bezier_basis0._2796_4_ + fVar203 * (float)bezier_basis0._3952_4_;
          auVar176._12_4_ =
               auVar73._12_4_ * (float)bezier_basis0._488_4_ +
               auVar36._12_4_ * (float)bezier_basis0._1644_4_ +
               fVar223 * (float)bezier_basis0._2800_4_ + fVar207 * (float)bezier_basis0._3956_4_;
          auVar176._16_4_ =
               fVar182 * (float)bezier_basis0._492_4_ +
               fVar209 * (float)bezier_basis0._1648_4_ +
               fVar219 * (float)bezier_basis0._2804_4_ + fVar198 * (float)bezier_basis0._3960_4_;
          auVar176._20_4_ =
               fVar187 * (float)bezier_basis0._496_4_ +
               fVar211 * (float)bezier_basis0._1652_4_ +
               fVar221 * (float)bezier_basis0._2808_4_ + fVar200 * (float)bezier_basis0._3964_4_;
          auVar176._24_4_ =
               fVar189 * (float)bezier_basis0._500_4_ +
               fVar216 * (float)bezier_basis0._1656_4_ +
               fVar222 * (float)bezier_basis0._2812_4_ + fVar203 * (float)bezier_basis0._3968_4_;
          auVar176._28_4_ = 0;
          auVar58 = vshufps_avx(auVar40,auVar40,0x55);
          fVar210 = auVar58._0_4_;
          fVar215 = auVar58._4_4_;
          fVar217 = auVar58._8_4_;
          auVar193._0_4_ =
               fVar199 * (float)bezier_basis0._2788_4_ + fVar218 * (float)bezier_basis0._3944_4_ +
               fVar181 * (float)bezier_basis0._1632_4_ + fVar210 * (float)bezier_basis0._476_4_;
          auVar193._4_4_ =
               fVar201 * (float)bezier_basis0._2792_4_ + fVar161 * (float)bezier_basis0._3948_4_ +
               fVar188 * (float)bezier_basis0._1636_4_ + fVar215 * (float)bezier_basis0._480_4_;
          auVar193._8_4_ =
               fVar206 * (float)bezier_basis0._2796_4_ + fVar162 * (float)bezier_basis0._3952_4_ +
               fVar191 * (float)bezier_basis0._1640_4_ + fVar217 * (float)bezier_basis0._484_4_;
          auVar193._12_4_ =
               fVar208 * (float)bezier_basis0._2800_4_ + fVar163 * (float)bezier_basis0._3956_4_ +
               fVar196 * (float)bezier_basis0._1644_4_ +
               auVar58._12_4_ * (float)bezier_basis0._488_4_;
          auVar193._16_4_ =
               fVar199 * (float)bezier_basis0._2804_4_ + fVar218 * (float)bezier_basis0._3960_4_ +
               fVar181 * (float)bezier_basis0._1648_4_ + fVar210 * (float)bezier_basis0._492_4_;
          auVar193._20_4_ =
               fVar201 * (float)bezier_basis0._2808_4_ + fVar161 * (float)bezier_basis0._3964_4_ +
               fVar188 * (float)bezier_basis0._1652_4_ + fVar215 * (float)bezier_basis0._496_4_;
          auVar193._24_4_ =
               fVar206 * (float)bezier_basis0._2812_4_ + fVar162 * (float)bezier_basis0._3968_4_ +
               fVar191 * (float)bezier_basis0._1656_4_ + fVar217 * (float)bezier_basis0._500_4_;
          auVar193._28_4_ = 0;
          auVar150 = vshufps_avx(auVar40,auVar40,0xaa);
          fVar197 = auVar150._0_4_;
          fVar118 = auVar150._4_4_;
          fVar127 = auVar150._8_4_;
          fVar128 = auVar150._12_4_;
          auVar225._0_4_ =
               fVar69 * (float)bezier_basis0._1632_4_ +
               fVar55 * (float)bezier_basis0._2788_4_ + fVar129 * (float)bezier_basis0._3944_4_ +
               fVar197 * (float)bezier_basis0._476_4_;
          auVar225._4_4_ =
               fVar71 * (float)bezier_basis0._1636_4_ +
               fVar70 * (float)bezier_basis0._2792_4_ + fVar164 * (float)bezier_basis0._3948_4_ +
               fVar118 * (float)bezier_basis0._480_4_;
          auVar225._8_4_ =
               fVar192 * (float)bezier_basis0._1640_4_ +
               fVar202 * (float)bezier_basis0._2796_4_ + fVar178 * (float)bezier_basis0._3952_4_ +
               fVar127 * (float)bezier_basis0._484_4_;
          auVar225._12_4_ =
               fVar195 * (float)bezier_basis0._1644_4_ +
               auVar57._12_4_ * (float)bezier_basis0._2800_4_ +
               fVar179 * (float)bezier_basis0._3956_4_ + fVar128 * (float)bezier_basis0._488_4_;
          auVar225._16_4_ =
               fVar69 * (float)bezier_basis0._1648_4_ +
               fVar55 * (float)bezier_basis0._2804_4_ + fVar129 * (float)bezier_basis0._3960_4_ +
               fVar197 * (float)bezier_basis0._492_4_;
          auVar225._20_4_ =
               fVar71 * (float)bezier_basis0._1652_4_ +
               fVar70 * (float)bezier_basis0._2808_4_ + fVar164 * (float)bezier_basis0._3964_4_ +
               fVar118 * (float)bezier_basis0._496_4_;
          auVar225._24_4_ =
               fVar192 * (float)bezier_basis0._1656_4_ +
               fVar202 * (float)bezier_basis0._2812_4_ + fVar178 * (float)bezier_basis0._3968_4_ +
               fVar127 * (float)bezier_basis0._500_4_;
          auVar225._28_4_ = 0;
          auVar112._0_4_ =
               fVar209 * (float)bezier_basis0._6256_4_ +
               fVar219 * (float)bezier_basis0._7412_4_ + fVar198 * (float)bezier_basis0._8568_4_ +
               fVar182 * (float)bezier_basis0._5100_4_;
          auVar112._4_4_ =
               fVar211 * (float)bezier_basis0._6260_4_ +
               fVar221 * (float)bezier_basis0._7416_4_ + fVar200 * (float)bezier_basis0._8572_4_ +
               fVar187 * (float)bezier_basis0._5104_4_;
          auVar112._8_4_ =
               fVar216 * (float)bezier_basis0._6264_4_ +
               fVar222 * (float)bezier_basis0._7420_4_ + fVar203 * (float)bezier_basis0._8576_4_ +
               fVar189 * (float)bezier_basis0._5108_4_;
          auVar112._12_4_ =
               auVar36._12_4_ * (float)bezier_basis0._6268_4_ +
               fVar223 * (float)bezier_basis0._7424_4_ + fVar207 * (float)bezier_basis0._8580_4_ +
               auVar73._12_4_ * (float)bezier_basis0._5112_4_;
          auVar112._16_4_ =
               fVar209 * (float)bezier_basis0._6272_4_ +
               fVar219 * (float)bezier_basis0._7428_4_ + fVar198 * (float)bezier_basis0._8584_4_ +
               fVar182 * (float)bezier_basis0._5116_4_;
          auVar112._20_4_ =
               fVar211 * (float)bezier_basis0._6276_4_ +
               fVar221 * (float)bezier_basis0._7432_4_ + fVar200 * (float)bezier_basis0._8588_4_ +
               fVar187 * (float)bezier_basis0._5120_4_;
          auVar112._24_4_ =
               fVar216 * (float)bezier_basis0._6280_4_ +
               fVar222 * (float)bezier_basis0._7436_4_ + fVar203 * (float)bezier_basis0._8592_4_ +
               fVar189 * (float)bezier_basis0._5124_4_;
          auVar112._28_4_ = fVar163 + fVar223 + fVar207 + fVar163 + fVar179;
          auVar65._0_4_ =
               fVar210 * (float)bezier_basis0._5100_4_ +
               fVar181 * (float)bezier_basis0._6256_4_ +
               fVar218 * (float)bezier_basis0._8568_4_ + fVar199 * (float)bezier_basis0._7412_4_;
          auVar65._4_4_ =
               fVar215 * (float)bezier_basis0._5104_4_ +
               fVar188 * (float)bezier_basis0._6260_4_ +
               fVar161 * (float)bezier_basis0._8572_4_ + fVar201 * (float)bezier_basis0._7416_4_;
          auVar65._8_4_ =
               fVar217 * (float)bezier_basis0._5108_4_ +
               fVar191 * (float)bezier_basis0._6264_4_ +
               fVar162 * (float)bezier_basis0._8576_4_ + fVar206 * (float)bezier_basis0._7420_4_;
          auVar65._12_4_ =
               auVar58._12_4_ * (float)bezier_basis0._5112_4_ +
               fVar196 * (float)bezier_basis0._6268_4_ +
               fVar163 * (float)bezier_basis0._8580_4_ + fVar208 * (float)bezier_basis0._7424_4_;
          auVar65._16_4_ =
               fVar210 * (float)bezier_basis0._5116_4_ +
               fVar181 * (float)bezier_basis0._6272_4_ +
               fVar218 * (float)bezier_basis0._8584_4_ + fVar199 * (float)bezier_basis0._7428_4_;
          auVar65._20_4_ =
               fVar215 * (float)bezier_basis0._5120_4_ +
               fVar188 * (float)bezier_basis0._6276_4_ +
               fVar161 * (float)bezier_basis0._8588_4_ + fVar201 * (float)bezier_basis0._7432_4_;
          auVar65._24_4_ =
               fVar217 * (float)bezier_basis0._5124_4_ +
               fVar191 * (float)bezier_basis0._6280_4_ +
               fVar162 * (float)bezier_basis0._8592_4_ + fVar206 * (float)bezier_basis0._7436_4_;
          auVar65._28_4_ = (float)bezier_basis0._8596_4_ + fVar196 + fVar163 + fVar208;
          auVar85._0_4_ =
               fVar197 * (float)bezier_basis0._5100_4_ +
               fVar69 * (float)bezier_basis0._6256_4_ +
               fVar129 * (float)bezier_basis0._8568_4_ + (float)bezier_basis0._7412_4_ * fVar55;
          auVar85._4_4_ =
               fVar118 * (float)bezier_basis0._5104_4_ +
               fVar71 * (float)bezier_basis0._6260_4_ +
               fVar164 * (float)bezier_basis0._8572_4_ + (float)bezier_basis0._7416_4_ * fVar70;
          auVar85._8_4_ =
               fVar127 * (float)bezier_basis0._5108_4_ +
               fVar192 * (float)bezier_basis0._6264_4_ +
               fVar178 * (float)bezier_basis0._8576_4_ + (float)bezier_basis0._7420_4_ * fVar202;
          auVar85._12_4_ =
               fVar128 * (float)bezier_basis0._5112_4_ +
               fVar195 * (float)bezier_basis0._6268_4_ +
               fVar179 * (float)bezier_basis0._8580_4_ +
               (float)bezier_basis0._7424_4_ * auVar57._12_4_;
          auVar85._16_4_ =
               fVar197 * (float)bezier_basis0._5116_4_ +
               fVar69 * (float)bezier_basis0._6272_4_ +
               fVar129 * (float)bezier_basis0._8584_4_ + (float)bezier_basis0._7428_4_ * fVar55;
          auVar85._20_4_ =
               fVar118 * (float)bezier_basis0._5120_4_ +
               fVar71 * (float)bezier_basis0._6276_4_ +
               fVar164 * (float)bezier_basis0._8588_4_ + (float)bezier_basis0._7432_4_ * fVar70;
          auVar85._24_4_ =
               fVar127 * (float)bezier_basis0._5124_4_ +
               fVar192 * (float)bezier_basis0._6280_4_ +
               fVar178 * (float)bezier_basis0._8592_4_ + (float)bezier_basis0._7436_4_ * fVar202;
          auVar85._28_4_ = fVar128 + fVar195 + fVar163 + fVar179;
          auVar157 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar10 = vblendps_avx(auVar112,auVar157,1);
          auVar157 = vblendps_avx(auVar65,auVar157,1);
          auVar158 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar185 = vblendps_avx(auVar85,auVar158,1);
          auVar177._4_4_ = auVar10._4_4_ * 0.055555556;
          auVar177._0_4_ = auVar10._0_4_ * 0.055555556;
          auVar177._8_4_ = auVar10._8_4_ * 0.055555556;
          auVar177._12_4_ = auVar10._12_4_ * 0.055555556;
          auVar177._16_4_ = auVar10._16_4_ * 0.055555556;
          auVar177._20_4_ = auVar10._20_4_ * 0.055555556;
          auVar177._24_4_ = auVar10._24_4_ * 0.055555556;
          auVar177._28_4_ = auVar10._28_4_;
          auVar10._4_4_ = auVar157._4_4_ * 0.055555556;
          auVar10._0_4_ = auVar157._0_4_ * 0.055555556;
          auVar10._8_4_ = auVar157._8_4_ * 0.055555556;
          auVar10._12_4_ = auVar157._12_4_ * 0.055555556;
          auVar10._16_4_ = auVar157._16_4_ * 0.055555556;
          auVar10._20_4_ = auVar157._20_4_ * 0.055555556;
          auVar10._24_4_ = auVar157._24_4_ * 0.055555556;
          auVar10._28_4_ = auVar157._28_4_;
          auVar157._4_4_ = auVar185._4_4_ * 0.055555556;
          auVar157._0_4_ = auVar185._0_4_ * 0.055555556;
          auVar157._8_4_ = auVar185._8_4_ * 0.055555556;
          auVar157._12_4_ = auVar185._12_4_ * 0.055555556;
          auVar157._16_4_ = auVar185._16_4_ * 0.055555556;
          auVar157._20_4_ = auVar185._20_4_ * 0.055555556;
          auVar157._24_4_ = auVar185._24_4_ * 0.055555556;
          auVar157._28_4_ = auVar185._28_4_;
          auVar177 = vsubps_avx(auVar176,auVar177);
          auVar97 = vsubps_avx(auVar193,auVar10);
          auVar14 = vsubps_avx(auVar225,auVar157);
          auVar10 = vblendps_avx(auVar112,auVar158,0x80);
          auVar157 = vblendps_avx(auVar65,auVar158,0x80);
          auVar185 = vblendps_avx(auVar85,auVar158,0x80);
          auVar113._0_4_ = auVar176._0_4_ + auVar10._0_4_ * 0.055555556;
          auVar113._4_4_ = auVar176._4_4_ + auVar10._4_4_ * 0.055555556;
          auVar113._8_4_ = auVar176._8_4_ + auVar10._8_4_ * 0.055555556;
          auVar113._12_4_ = auVar176._12_4_ + auVar10._12_4_ * 0.055555556;
          auVar113._16_4_ = auVar176._16_4_ + auVar10._16_4_ * 0.055555556;
          auVar113._20_4_ = auVar176._20_4_ + auVar10._20_4_ * 0.055555556;
          auVar113._24_4_ = auVar176._24_4_ + auVar10._24_4_ * 0.055555556;
          auVar113._28_4_ = auVar10._28_4_ + 0.0;
          auVar66._0_4_ = auVar193._0_4_ + auVar157._0_4_ * 0.055555556;
          auVar66._4_4_ = auVar193._4_4_ + auVar157._4_4_ * 0.055555556;
          auVar66._8_4_ = auVar193._8_4_ + auVar157._8_4_ * 0.055555556;
          auVar66._12_4_ = auVar193._12_4_ + auVar157._12_4_ * 0.055555556;
          auVar66._16_4_ = auVar193._16_4_ + auVar157._16_4_ * 0.055555556;
          auVar66._20_4_ = auVar193._20_4_ + auVar157._20_4_ * 0.055555556;
          auVar66._24_4_ = auVar193._24_4_ + auVar157._24_4_ * 0.055555556;
          auVar66._28_4_ = auVar157._28_4_ + 0.0;
          auVar147._0_4_ = auVar225._0_4_ + auVar185._0_4_ * 0.055555556;
          auVar147._4_4_ = auVar225._4_4_ + auVar185._4_4_ * 0.055555556;
          auVar147._8_4_ = auVar225._8_4_ + auVar185._8_4_ * 0.055555556;
          auVar147._12_4_ = auVar225._12_4_ + auVar185._12_4_ * 0.055555556;
          auVar147._16_4_ = auVar225._16_4_ + auVar185._16_4_ * 0.055555556;
          auVar147._20_4_ = auVar225._20_4_ + auVar185._20_4_ * 0.055555556;
          auVar147._24_4_ = auVar225._24_4_ + auVar185._24_4_ * 0.055555556;
          auVar147._28_4_ = auVar185._28_4_ + 0.0;
          auVar46._8_4_ = 0x7f800000;
          auVar46._0_8_ = 0x7f8000007f800000;
          auVar46._12_4_ = 0x7f800000;
          auVar46._16_4_ = 0x7f800000;
          auVar46._20_4_ = 0x7f800000;
          auVar46._24_4_ = 0x7f800000;
          auVar46._28_4_ = 0x7f800000;
          auVar10 = vminps_avx(auVar46,auVar176);
          auVar157 = vminps_avx(auVar46,auVar193);
          auVar185 = vminps_avx(auVar177,auVar113);
          auVar158 = vminps_avx(auVar10,auVar185);
          auVar10 = vminps_avx(auVar97,auVar66);
          auVar13 = vminps_avx(auVar157,auVar10);
          auVar10 = vminps_avx(auVar46,auVar225);
          auVar157 = vminps_avx(auVar14,auVar147);
          auVar204 = vminps_avx(auVar10,auVar157);
          auVar224._0_4_ = (fVar180 + auVar42._0_4_) * 0.33333334 + fVar92;
          auVar224._4_4_ = (fVar186 + auVar42._4_4_) * 0.33333334 + fVar100;
          auVar224._8_4_ = (fVar190 + auVar42._8_4_) * 0.33333334 + fVar101;
          auVar224._12_4_ = (fVar194 + auVar42._12_4_) * 0.33333334 + fVar102;
          auVar79._0_4_ = (fVar35 + auVar108._0_4_) * 0.33333334;
          auVar79._4_4_ = (fVar53 + auVar108._4_4_) * 0.33333334;
          auVar79._8_4_ = (fVar54 + auVar108._8_4_) * 0.33333334;
          auVar79._12_4_ = (fVar72 + auVar108._12_4_) * 0.33333334;
          auVar60 = vsubps_avx(_local_1c8,auVar79);
          auVar213._8_4_ = 0xff800000;
          auVar213._0_8_ = 0xff800000ff800000;
          auVar213._12_4_ = 0xff800000;
          auVar213._16_4_ = 0xff800000;
          auVar213._20_4_ = 0xff800000;
          auVar213._24_4_ = 0xff800000;
          auVar213._28_4_ = 0xff800000;
          auVar10 = vmaxps_avx(auVar213,auVar176);
          auVar157 = vmaxps_avx(auVar213,auVar193);
          auVar185 = vmaxps_avx(auVar213,auVar225);
          auVar177 = vmaxps_avx(auVar177,auVar113);
          auVar10 = vmaxps_avx(auVar10,auVar177);
          auVar177 = vmaxps_avx(auVar97,auVar66);
          auVar157 = vmaxps_avx(auVar157,auVar177);
          auVar177 = vmaxps_avx(auVar14,auVar147);
          auVar185 = vmaxps_avx(auVar185,auVar177);
          auVar177 = vshufps_avx(auVar158,auVar158,0xb1);
          auVar177 = vminps_avx(auVar158,auVar177);
          auVar158 = vshufpd_avx(auVar177,auVar177,5);
          auVar177 = vminps_avx(auVar177,auVar158);
          auVar36 = vminps_avx(auVar177._0_16_,auVar177._16_16_);
          auVar177 = vshufps_avx(auVar13,auVar13,0xb1);
          auVar177 = vminps_avx(auVar13,auVar177);
          auVar158 = vshufpd_avx(auVar177,auVar177,5);
          auVar177 = vminps_avx(auVar177,auVar158);
          auVar73 = vminps_avx(auVar177._0_16_,auVar177._16_16_);
          auVar73 = vunpcklps_avx(auVar36,auVar73);
          auVar177 = vshufps_avx(auVar204,auVar204,0xb1);
          auVar177 = vminps_avx(auVar204,auVar177);
          auVar158 = vshufpd_avx(auVar177,auVar177,5);
          auVar177 = vminps_avx(auVar177,auVar158);
          auVar36 = vminps_avx(auVar177._0_16_,auVar177._16_16_);
          auVar36 = vinsertps_avx(auVar73,auVar36,0x28);
          auVar177 = vshufps_avx(auVar10,auVar10,0xb1);
          auVar10 = vmaxps_avx(auVar10,auVar177);
          auVar177 = vshufpd_avx(auVar10,auVar10,5);
          auVar10 = vmaxps_avx(auVar10,auVar177);
          auVar73 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
          auVar10 = vshufps_avx(auVar157,auVar157,0xb1);
          auVar10 = vmaxps_avx(auVar157,auVar10);
          auVar157 = vshufpd_avx(auVar10,auVar10,5);
          auVar10 = vmaxps_avx(auVar10,auVar157);
          auVar57 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
          auVar57 = vunpcklps_avx(auVar73,auVar57);
          auVar10 = vshufps_avx(auVar185,auVar185,0xb1);
          auVar10 = vmaxps_avx(auVar185,auVar10);
          auVar157 = vshufpd_avx(auVar10,auVar10,5);
          auVar10 = vmaxps_avx(auVar10,auVar157);
          auVar73 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
          auVar73 = vinsertps_avx(auVar57,auVar73,0x28);
          auVar57 = vshufps_avx(auVar224,auVar224,0);
          auVar58 = vshufps_avx(auVar224,auVar224,0x55);
          auVar150 = vshufps_avx(auVar224,auVar224,0xaa);
          auVar37 = vshufps_avx(auVar60,auVar60,0);
          auVar38 = vshufps_avx(auVar60,auVar60,0x55);
          auVar60 = vshufps_avx(auVar60,auVar60,0xaa);
          auVar79 = vshufps_avx(_local_1c8,_local_1c8,0);
          auVar39 = vshufps_avx(_local_1c8,_local_1c8,0x55);
          auVar40 = vshufps_avx(_local_1c8,_local_1c8,0xaa);
          fVar210 = auVar79._0_4_;
          fVar215 = auVar79._4_4_;
          fVar217 = auVar79._8_4_;
          fVar180 = auVar39._0_4_;
          fVar181 = auVar39._4_4_;
          fVar186 = auVar39._8_4_;
          fVar194 = auVar40._0_4_;
          fVar196 = auVar40._4_4_;
          fVar199 = auVar40._8_4_;
          fVar218 = auVar37._0_4_;
          fVar161 = auVar37._4_4_;
          fVar162 = auVar37._8_4_;
          fVar188 = auVar38._0_4_;
          fVar190 = auVar38._4_4_;
          fVar191 = auVar38._8_4_;
          fVar201 = auVar60._0_4_;
          fVar206 = auVar60._4_4_;
          fVar208 = auVar60._8_4_;
          fVar164 = auVar57._0_4_;
          fVar178 = auVar57._4_4_;
          fVar179 = auVar57._8_4_;
          fVar118 = auVar58._0_4_;
          fVar127 = auVar58._4_4_;
          fVar128 = auVar58._8_4_;
          fVar129 = auVar58._12_4_;
          fVar202 = auVar150._0_4_;
          fVar192 = auVar150._4_4_;
          fVar195 = auVar150._8_4_;
          fVar197 = auVar150._12_4_;
          auVar20._4_4_ = fVar100;
          auVar20._0_4_ = fVar92;
          auVar20._8_4_ = fVar101;
          auVar20._12_4_ = fVar102;
          auVar58 = vshufps_avx(auVar20,auVar20,0);
          fVar92 = auVar58._0_4_;
          fVar100 = auVar58._4_4_;
          fVar101 = auVar58._8_4_;
          auVar86._0_4_ =
               fVar92 * (float)bezier_basis0._476_4_ +
               fVar164 * (float)bezier_basis0._1632_4_ +
               fVar218 * (float)bezier_basis0._2788_4_ + fVar210 * (float)bezier_basis0._3944_4_;
          auVar86._4_4_ =
               fVar100 * (float)bezier_basis0._480_4_ +
               fVar178 * (float)bezier_basis0._1636_4_ +
               fVar161 * (float)bezier_basis0._2792_4_ + fVar215 * (float)bezier_basis0._3948_4_;
          auVar86._8_4_ =
               fVar101 * (float)bezier_basis0._484_4_ +
               fVar179 * (float)bezier_basis0._1640_4_ +
               fVar162 * (float)bezier_basis0._2796_4_ + fVar217 * (float)bezier_basis0._3952_4_;
          auVar86._12_4_ =
               auVar58._12_4_ * (float)bezier_basis0._488_4_ +
               auVar57._12_4_ * (float)bezier_basis0._1644_4_ +
               auVar37._12_4_ * (float)bezier_basis0._2800_4_ +
               auVar79._12_4_ * (float)bezier_basis0._3956_4_;
          auVar86._16_4_ =
               fVar92 * (float)bezier_basis0._492_4_ +
               fVar164 * (float)bezier_basis0._1648_4_ +
               fVar218 * (float)bezier_basis0._2804_4_ + fVar210 * (float)bezier_basis0._3960_4_;
          auVar86._20_4_ =
               fVar100 * (float)bezier_basis0._496_4_ +
               fVar178 * (float)bezier_basis0._1652_4_ +
               fVar161 * (float)bezier_basis0._2808_4_ + fVar215 * (float)bezier_basis0._3964_4_;
          auVar86._24_4_ =
               fVar101 * (float)bezier_basis0._500_4_ +
               fVar179 * (float)bezier_basis0._1656_4_ +
               fVar162 * (float)bezier_basis0._2812_4_ + fVar217 * (float)bezier_basis0._3968_4_;
          auVar86._28_4_ = 0xff800000;
          auVar150 = vshufps_avx(auVar20,auVar20,0x55);
          fVar35 = auVar150._0_4_;
          fVar53 = auVar150._4_4_;
          fVar54 = auVar150._8_4_;
          fVar72 = auVar150._12_4_;
          auVar138._0_4_ =
               fVar35 * (float)bezier_basis0._476_4_ +
               fVar118 * (float)bezier_basis0._1632_4_ +
               fVar188 * (float)bezier_basis0._2788_4_ + fVar180 * (float)bezier_basis0._3944_4_;
          auVar138._4_4_ =
               fVar53 * (float)bezier_basis0._480_4_ +
               fVar127 * (float)bezier_basis0._1636_4_ +
               fVar190 * (float)bezier_basis0._2792_4_ + fVar181 * (float)bezier_basis0._3948_4_;
          auVar138._8_4_ =
               fVar54 * (float)bezier_basis0._484_4_ +
               fVar128 * (float)bezier_basis0._1640_4_ +
               fVar191 * (float)bezier_basis0._2796_4_ + fVar186 * (float)bezier_basis0._3952_4_;
          auVar138._12_4_ =
               fVar72 * (float)bezier_basis0._488_4_ +
               fVar129 * (float)bezier_basis0._1644_4_ +
               auVar38._12_4_ * (float)bezier_basis0._2800_4_ +
               auVar39._12_4_ * (float)bezier_basis0._3956_4_;
          auVar138._16_4_ =
               fVar35 * (float)bezier_basis0._492_4_ +
               fVar118 * (float)bezier_basis0._1648_4_ +
               fVar188 * (float)bezier_basis0._2804_4_ + fVar180 * (float)bezier_basis0._3960_4_;
          auVar138._20_4_ =
               fVar53 * (float)bezier_basis0._496_4_ +
               fVar127 * (float)bezier_basis0._1652_4_ +
               fVar190 * (float)bezier_basis0._2808_4_ + fVar181 * (float)bezier_basis0._3964_4_;
          auVar138._24_4_ =
               fVar54 * (float)bezier_basis0._500_4_ +
               fVar128 * (float)bezier_basis0._1656_4_ +
               fVar191 * (float)bezier_basis0._2812_4_ + fVar186 * (float)bezier_basis0._3968_4_;
          auVar138._28_4_ = 0xff800000;
          auVar150 = vshufps_avx(auVar20,auVar20,0xaa);
          fVar69 = auVar150._0_4_;
          fVar70 = auVar150._4_4_;
          fVar71 = auVar150._8_4_;
          auVar214._0_4_ =
               fVar202 * (float)bezier_basis0._1632_4_ +
               fVar201 * (float)bezier_basis0._2788_4_ + fVar194 * (float)bezier_basis0._3944_4_ +
               fVar69 * (float)bezier_basis0._476_4_;
          auVar214._4_4_ =
               fVar192 * (float)bezier_basis0._1636_4_ +
               fVar206 * (float)bezier_basis0._2792_4_ + fVar196 * (float)bezier_basis0._3948_4_ +
               fVar70 * (float)bezier_basis0._480_4_;
          auVar214._8_4_ =
               fVar195 * (float)bezier_basis0._1640_4_ +
               fVar208 * (float)bezier_basis0._2796_4_ + fVar199 * (float)bezier_basis0._3952_4_ +
               fVar71 * (float)bezier_basis0._484_4_;
          auVar214._12_4_ =
               fVar197 * (float)bezier_basis0._1644_4_ +
               auVar60._12_4_ * (float)bezier_basis0._2800_4_ +
               auVar40._12_4_ * (float)bezier_basis0._3956_4_ +
               auVar150._12_4_ * (float)bezier_basis0._488_4_;
          auVar214._16_4_ =
               fVar202 * (float)bezier_basis0._1648_4_ +
               fVar201 * (float)bezier_basis0._2804_4_ + fVar194 * (float)bezier_basis0._3960_4_ +
               fVar69 * (float)bezier_basis0._492_4_;
          auVar214._20_4_ =
               fVar192 * (float)bezier_basis0._1652_4_ +
               fVar206 * (float)bezier_basis0._2808_4_ + fVar196 * (float)bezier_basis0._3964_4_ +
               fVar70 * (float)bezier_basis0._496_4_;
          auVar214._24_4_ =
               fVar195 * (float)bezier_basis0._1656_4_ +
               fVar208 * (float)bezier_basis0._2812_4_ + fVar199 * (float)bezier_basis0._3968_4_ +
               fVar71 * (float)bezier_basis0._500_4_;
          auVar214._28_4_ = 0xff800000;
          fVar55 = (float)bezier_basis0._8596_4_ + 0.0 + 0.0;
          auVar122._0_4_ =
               fVar92 * (float)bezier_basis0._5100_4_ +
               (float)bezier_basis0._6256_4_ * fVar164 +
               fVar218 * (float)bezier_basis0._7412_4_ + fVar210 * (float)bezier_basis0._8568_4_;
          auVar122._4_4_ =
               fVar100 * (float)bezier_basis0._5104_4_ +
               (float)bezier_basis0._6260_4_ * fVar178 +
               fVar161 * (float)bezier_basis0._7416_4_ + fVar215 * (float)bezier_basis0._8572_4_;
          auVar122._8_4_ =
               fVar101 * (float)bezier_basis0._5108_4_ +
               (float)bezier_basis0._6264_4_ * fVar179 +
               fVar162 * (float)bezier_basis0._7420_4_ + fVar217 * (float)bezier_basis0._8576_4_;
          auVar122._12_4_ =
               auVar58._12_4_ * (float)bezier_basis0._5112_4_ +
               (float)bezier_basis0._6268_4_ * auVar57._12_4_ +
               auVar37._12_4_ * (float)bezier_basis0._7424_4_ +
               auVar79._12_4_ * (float)bezier_basis0._8580_4_;
          auVar122._16_4_ =
               fVar92 * (float)bezier_basis0._5116_4_ +
               (float)bezier_basis0._6272_4_ * fVar164 +
               fVar218 * (float)bezier_basis0._7428_4_ + fVar210 * (float)bezier_basis0._8584_4_;
          auVar122._20_4_ =
               fVar100 * (float)bezier_basis0._5120_4_ +
               (float)bezier_basis0._6276_4_ * fVar178 +
               fVar161 * (float)bezier_basis0._7432_4_ + fVar215 * (float)bezier_basis0._8588_4_;
          auVar122._24_4_ =
               fVar101 * (float)bezier_basis0._5124_4_ +
               (float)bezier_basis0._6280_4_ * fVar179 +
               fVar162 * (float)bezier_basis0._7436_4_ + fVar217 * (float)bezier_basis0._8592_4_;
          auVar122._28_4_ = fVar129 + 0.0 + 0.0 + 0.0;
          auVar47._0_4_ =
               (float)bezier_basis0._5100_4_ * fVar35 +
               (float)bezier_basis0._6256_4_ * fVar118 +
               fVar188 * (float)bezier_basis0._7412_4_ + fVar180 * (float)bezier_basis0._8568_4_;
          auVar47._4_4_ =
               (float)bezier_basis0._5104_4_ * fVar53 +
               (float)bezier_basis0._6260_4_ * fVar127 +
               fVar190 * (float)bezier_basis0._7416_4_ + fVar181 * (float)bezier_basis0._8572_4_;
          auVar47._8_4_ =
               (float)bezier_basis0._5108_4_ * fVar54 +
               (float)bezier_basis0._6264_4_ * fVar128 +
               fVar191 * (float)bezier_basis0._7420_4_ + fVar186 * (float)bezier_basis0._8576_4_;
          auVar47._12_4_ =
               (float)bezier_basis0._5112_4_ * fVar72 +
               (float)bezier_basis0._6268_4_ * fVar129 +
               auVar38._12_4_ * (float)bezier_basis0._7424_4_ +
               auVar39._12_4_ * (float)bezier_basis0._8580_4_;
          auVar47._16_4_ =
               (float)bezier_basis0._5116_4_ * fVar35 +
               (float)bezier_basis0._6272_4_ * fVar118 +
               fVar188 * (float)bezier_basis0._7428_4_ + fVar180 * (float)bezier_basis0._8584_4_;
          auVar47._20_4_ =
               (float)bezier_basis0._5120_4_ * fVar53 +
               (float)bezier_basis0._6276_4_ * fVar127 +
               fVar190 * (float)bezier_basis0._7432_4_ + fVar181 * (float)bezier_basis0._8588_4_;
          auVar47._24_4_ =
               (float)bezier_basis0._5124_4_ * fVar54 +
               (float)bezier_basis0._6280_4_ * fVar128 +
               fVar191 * (float)bezier_basis0._7436_4_ + fVar186 * (float)bezier_basis0._8592_4_;
          auVar47._28_4_ = fVar72 + fVar55;
          auVar67._0_4_ =
               (float)bezier_basis0._5100_4_ * fVar69 +
               (float)bezier_basis0._6256_4_ * fVar202 +
               fVar201 * (float)bezier_basis0._7412_4_ + fVar194 * (float)bezier_basis0._8568_4_;
          auVar67._4_4_ =
               (float)bezier_basis0._5104_4_ * fVar70 +
               (float)bezier_basis0._6260_4_ * fVar192 +
               fVar206 * (float)bezier_basis0._7416_4_ + fVar196 * (float)bezier_basis0._8572_4_;
          auVar67._8_4_ =
               (float)bezier_basis0._5108_4_ * fVar71 +
               (float)bezier_basis0._6264_4_ * fVar195 +
               fVar208 * (float)bezier_basis0._7420_4_ + fVar199 * (float)bezier_basis0._8576_4_;
          auVar67._12_4_ =
               (float)bezier_basis0._5112_4_ * auVar150._12_4_ +
               (float)bezier_basis0._6268_4_ * fVar197 +
               auVar60._12_4_ * (float)bezier_basis0._7424_4_ +
               auVar40._12_4_ * (float)bezier_basis0._8580_4_;
          auVar67._16_4_ =
               (float)bezier_basis0._5116_4_ * fVar69 +
               (float)bezier_basis0._6272_4_ * fVar202 +
               fVar201 * (float)bezier_basis0._7428_4_ + fVar194 * (float)bezier_basis0._8584_4_;
          auVar67._20_4_ =
               (float)bezier_basis0._5120_4_ * fVar70 +
               (float)bezier_basis0._6276_4_ * fVar192 +
               fVar206 * (float)bezier_basis0._7432_4_ + fVar196 * (float)bezier_basis0._8588_4_;
          auVar67._24_4_ =
               (float)bezier_basis0._5124_4_ * fVar71 +
               (float)bezier_basis0._6280_4_ * fVar195 +
               fVar208 * (float)bezier_basis0._7436_4_ + fVar199 * (float)bezier_basis0._8592_4_;
          auVar67._28_4_ = fVar55 + fVar197 + 0.0 + 0.0;
          auVar10 = vblendps_avx(auVar122,ZEXT832(0) << 0x20,1);
          auVar157 = vblendps_avx(auVar47,ZEXT832(0) << 0x20,1);
          auVar177 = ZEXT832(0) << 0x20;
          auVar185 = vblendps_avx(auVar67,auVar177,1);
          auVar158._4_4_ = auVar10._4_4_ * 0.055555556;
          auVar158._0_4_ = auVar10._0_4_ * 0.055555556;
          auVar158._8_4_ = auVar10._8_4_ * 0.055555556;
          auVar158._12_4_ = auVar10._12_4_ * 0.055555556;
          auVar158._16_4_ = auVar10._16_4_ * 0.055555556;
          auVar158._20_4_ = auVar10._20_4_ * 0.055555556;
          auVar158._24_4_ = auVar10._24_4_ * 0.055555556;
          auVar158._28_4_ = auVar10._28_4_;
          auVar13._4_4_ = auVar157._4_4_ * 0.055555556;
          auVar13._0_4_ = auVar157._0_4_ * 0.055555556;
          auVar13._8_4_ = auVar157._8_4_ * 0.055555556;
          auVar13._12_4_ = auVar157._12_4_ * 0.055555556;
          auVar13._16_4_ = auVar157._16_4_ * 0.055555556;
          auVar13._20_4_ = auVar157._20_4_ * 0.055555556;
          auVar13._24_4_ = auVar157._24_4_ * 0.055555556;
          auVar13._28_4_ = auVar157._28_4_;
          auVar204._4_4_ = auVar185._4_4_ * 0.055555556;
          auVar204._0_4_ = auVar185._0_4_ * 0.055555556;
          auVar204._8_4_ = auVar185._8_4_ * 0.055555556;
          auVar204._12_4_ = auVar185._12_4_ * 0.055555556;
          auVar204._16_4_ = auVar185._16_4_ * 0.055555556;
          auVar204._20_4_ = auVar185._20_4_ * 0.055555556;
          auVar204._24_4_ = auVar185._24_4_ * 0.055555556;
          auVar204._28_4_ = auVar185._28_4_;
          auVar97 = vsubps_avx(auVar86,auVar158);
          auVar14 = vsubps_avx(auVar138,auVar13);
          auVar46 = vsubps_avx(auVar214,auVar204);
          auVar10 = vblendps_avx(auVar122,auVar177,0x80);
          auVar157 = vblendps_avx(auVar47,auVar177,0x80);
          auVar185 = vblendps_avx(auVar67,auVar177,0x80);
          auVar123._0_4_ = auVar86._0_4_ + auVar10._0_4_ * 0.055555556;
          auVar123._4_4_ = auVar86._4_4_ + auVar10._4_4_ * 0.055555556;
          auVar123._8_4_ = auVar86._8_4_ + auVar10._8_4_ * 0.055555556;
          auVar123._12_4_ = auVar86._12_4_ + auVar10._12_4_ * 0.055555556;
          auVar123._16_4_ = auVar86._16_4_ + auVar10._16_4_ * 0.055555556;
          auVar123._20_4_ = auVar86._20_4_ + auVar10._20_4_ * 0.055555556;
          auVar123._24_4_ = auVar86._24_4_ + auVar10._24_4_ * 0.055555556;
          auVar123._28_4_ = auVar10._28_4_ + -INFINITY;
          auVar48._0_4_ = auVar138._0_4_ + auVar157._0_4_ * 0.055555556;
          auVar48._4_4_ = auVar138._4_4_ + auVar157._4_4_ * 0.055555556;
          auVar48._8_4_ = auVar138._8_4_ + auVar157._8_4_ * 0.055555556;
          auVar48._12_4_ = auVar138._12_4_ + auVar157._12_4_ * 0.055555556;
          auVar48._16_4_ = auVar138._16_4_ + auVar157._16_4_ * 0.055555556;
          auVar48._20_4_ = auVar138._20_4_ + auVar157._20_4_ * 0.055555556;
          auVar48._24_4_ = auVar138._24_4_ + auVar157._24_4_ * 0.055555556;
          auVar48._28_4_ = auVar157._28_4_ + -INFINITY;
          auVar159._0_4_ = auVar214._0_4_ + auVar185._0_4_ * 0.055555556;
          auVar159._4_4_ = auVar214._4_4_ + auVar185._4_4_ * 0.055555556;
          auVar159._8_4_ = auVar214._8_4_ + auVar185._8_4_ * 0.055555556;
          auVar159._12_4_ = auVar214._12_4_ + auVar185._12_4_ * 0.055555556;
          auVar159._16_4_ = auVar214._16_4_ + auVar185._16_4_ * 0.055555556;
          auVar159._20_4_ = auVar214._20_4_ + auVar185._20_4_ * 0.055555556;
          auVar159._24_4_ = auVar214._24_4_ + auVar185._24_4_ * 0.055555556;
          auVar159._28_4_ = auVar185._28_4_ + -INFINITY;
          auVar185._8_4_ = 0x7f800000;
          auVar185._0_8_ = 0x7f8000007f800000;
          auVar185._12_4_ = 0x7f800000;
          auVar185._16_4_ = 0x7f800000;
          auVar185._20_4_ = 0x7f800000;
          auVar185._24_4_ = 0x7f800000;
          auVar185._28_4_ = 0x7f800000;
          auVar10 = vminps_avx(auVar185,auVar86);
          auVar157 = vminps_avx(auVar185,auVar138);
          auVar185 = vminps_avx(auVar185,auVar214);
          auVar177 = vminps_avx(auVar97,auVar123);
          auVar158 = vminps_avx(auVar10,auVar177);
          auVar10 = vminps_avx(auVar14,auVar48);
          auVar13 = vminps_avx(auVar157,auVar10);
          auVar10 = vminps_avx(auVar46,auVar159);
          auVar204 = vminps_avx(auVar185,auVar10);
          auVar10 = vmaxps_avx(auVar97,auVar123);
          auVar97._8_4_ = 0xff800000;
          auVar97._0_8_ = 0xff800000ff800000;
          auVar97._12_4_ = 0xff800000;
          auVar97._16_4_ = 0xff800000;
          auVar97._20_4_ = 0xff800000;
          auVar97._24_4_ = 0xff800000;
          auVar97._28_4_ = 0xff800000;
          auVar157 = vmaxps_avx(auVar97,auVar86);
          auVar10 = vmaxps_avx(auVar157,auVar10);
          auVar157 = vmaxps_avx(auVar14,auVar48);
          auVar185 = vmaxps_avx(auVar97,auVar138);
          auVar157 = vmaxps_avx(auVar185,auVar157);
          auVar185 = vmaxps_avx(auVar46,auVar159);
          auVar153._8_4_ = 0xddccb9a2;
          auVar153._0_8_ = 0xddccb9a2ddccb9a2;
          auVar153._12_4_ = 0xddccb9a2;
          auVar160 = ZEXT1664(auVar153);
          auVar142._8_4_ = 0x5dccb9a2;
          auVar142._0_8_ = 0x5dccb9a25dccb9a2;
          auVar142._12_4_ = 0x5dccb9a2;
          auVar149 = ZEXT1664(auVar142);
          auVar177 = vmaxps_avx(auVar97,auVar214);
          auVar185 = vmaxps_avx(auVar177,auVar185);
          auVar177 = vshufps_avx(auVar158,auVar158,0xb1);
          auVar177 = vminps_avx(auVar158,auVar177);
          auVar158 = vshufpd_avx(auVar177,auVar177,5);
          auVar177 = vminps_avx(auVar177,auVar158);
          auVar57 = vminps_avx(auVar177._0_16_,auVar177._16_16_);
          auVar177 = vshufps_avx(auVar13,auVar13,0xb1);
          auVar177 = vminps_avx(auVar13,auVar177);
          auVar158 = vshufpd_avx(auVar177,auVar177,5);
          auVar177 = vminps_avx(auVar177,auVar158);
          auVar58 = vminps_avx(auVar177._0_16_,auVar177._16_16_);
          auVar58 = vunpcklps_avx(auVar57,auVar58);
          auVar177 = vshufps_avx(auVar204,auVar204,0xb1);
          auVar177 = vminps_avx(auVar204,auVar177);
          auVar158 = vshufpd_avx(auVar177,auVar177,5);
          auVar177 = vminps_avx(auVar177,auVar158);
          auVar57 = vminps_avx(auVar177._0_16_,auVar177._16_16_);
          auVar57 = vinsertps_avx(auVar58,auVar57,0x28);
          auVar58 = vminps_avx(auVar36,auVar57);
          auVar177 = vshufps_avx(auVar10,auVar10,0xb1);
          auVar10 = vmaxps_avx(auVar10,auVar177);
          auVar177 = vshufpd_avx(auVar10,auVar10,5);
          auVar10 = vmaxps_avx(auVar10,auVar177);
          auVar36 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
          auVar10 = vshufps_avx(auVar157,auVar157,0xb1);
          auVar10 = vmaxps_avx(auVar157,auVar10);
          auVar157 = vshufpd_avx(auVar10,auVar10,5);
          auVar10 = vmaxps_avx(auVar10,auVar157);
          auVar57 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
          auVar57 = vunpcklps_avx(auVar36,auVar57);
          auVar10 = vshufps_avx(auVar185,auVar185,0xb1);
          auVar10 = vmaxps_avx(auVar185,auVar10);
          auVar157 = vshufpd_avx(auVar10,auVar10,5);
          auVar10 = vmaxps_avx(auVar10,auVar157);
          auVar36 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
          auVar36 = vinsertps_avx(auVar57,auVar36,0x28);
          auVar73 = vmaxps_avx(auVar73,auVar36);
          auVar36 = vcmpps_avx(auVar58,auVar153,6);
          auVar73 = vcmpps_avx(auVar73,auVar142,1);
          auVar36 = vandps_avx(auVar73,auVar36);
          uVar33 = vmovmskps_avx(auVar36);
          if ((~(byte)uVar33 & 7) != 0) break;
          bVar34 = uVar25 <= uVar24;
          uVar24 = uVar24 + 1;
          lVar29 = lVar29 + 0x38;
        } while (uVar25 + 1 != uVar24);
        if (bVar34) {
          pcVar8 = (pBVar5->super_RawBufferView).ptr_ofs;
          sVar9 = (pBVar5->super_RawBufferView).stride;
          lVar29 = sVar9 * (uVar4 + 1);
          lVar30 = sVar9 * (uVar4 + 2);
          fVar56 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                   maxRadiusScale;
          auVar36 = vinsertps_avx(*(undefined1 (*) [16])(pcVar8 + sVar9 * uVar27),
                                  ZEXT416((uint)(fVar56 * *(float *)(pcVar8 + sVar9 * uVar27 + 0xc))
                                         ),0x30);
          auVar73 = vinsertps_avx(*(undefined1 (*) [16])(pcVar8 + lVar29),
                                  ZEXT416((uint)(fVar56 * *(float *)(pcVar8 + lVar29 + 0xc))),0x30);
          auVar57 = vinsertps_avx(*(undefined1 (*) [16])(pcVar8 + lVar30),
                                  ZEXT416((uint)(fVar56 * *(float *)(pcVar8 + lVar30 + 0xc))),0x30);
          auVar58 = vinsertps_avx(*(undefined1 (*) [16])(pcVar8 + sVar9 * uVar32),
                                  ZEXT416((uint)(fVar56 * *(float *)(pcVar8 + sVar9 * uVar32 + 0xc))
                                         ),0x30);
          pBVar6 = (this->super_CurveGeometryInterface<embree::BezierCurveT>).super_CurveGeometry.
                   normals.items;
          pcVar8 = (pBVar6->super_RawBufferView).ptr_ofs;
          sVar9 = (pBVar6->super_RawBufferView).stride;
          pfVar1 = (float *)(pcVar8 + uVar27 * sVar9);
          fVar72 = *pfVar1;
          fVar55 = pfVar1[1];
          fVar69 = pfVar1[2];
          fVar70 = pfVar1[3];
          pfVar1 = (float *)(pcVar8 + (uVar4 + 1) * sVar9);
          pfVar2 = (float *)(pcVar8 + (uVar4 + 2) * sVar9);
          pfVar3 = (float *)(pcVar8 + sVar9 * uVar32);
          fVar71 = *pfVar3;
          fVar202 = pfVar3[1];
          fVar92 = pfVar3[2];
          fVar192 = pfVar3[3];
          fVar56 = auVar58._0_4_;
          fVar35 = auVar58._4_4_;
          fVar53 = auVar58._8_4_;
          fVar54 = auVar58._12_4_;
          fVar180 = auVar57._0_4_ * 0.0;
          fVar181 = auVar57._4_4_ * 0.0;
          fVar186 = auVar57._8_4_ * 0.0;
          fVar188 = auVar57._12_4_ * 0.0;
          fVar129 = fVar180 + fVar56 * 0.0;
          fVar164 = fVar181 + fVar35 * 0.0;
          fVar178 = fVar186 + fVar53 * 0.0;
          fVar179 = fVar188 + fVar54 * 0.0;
          fVar190 = auVar73._0_4_ * 0.0;
          fVar191 = auVar73._4_4_ * 0.0;
          fVar194 = auVar73._8_4_ * 0.0;
          fVar196 = auVar73._12_4_ * 0.0;
          fVar195 = auVar36._0_4_;
          fVar100 = fVar195 + fVar190 + fVar129;
          fVar197 = auVar36._4_4_;
          fVar101 = fVar197 + fVar191 + fVar164;
          fVar118 = auVar36._8_4_;
          fVar102 = fVar118 + fVar194 + fVar178;
          fVar128 = auVar36._12_4_;
          fVar127 = fVar128 + fVar196 + fVar179;
          auVar93._0_4_ = auVar73._0_4_ * 3.0 + fVar129;
          auVar93._4_4_ = auVar73._4_4_ * 3.0 + fVar164;
          auVar93._8_4_ = auVar73._8_4_ * 3.0 + fVar178;
          auVar93._12_4_ = auVar73._12_4_ * 3.0 + fVar179;
          auVar171._0_4_ = fVar195 * 3.0;
          auVar171._4_4_ = fVar197 * 3.0;
          auVar171._8_4_ = fVar118 * 3.0;
          auVar171._12_4_ = fVar128 * 3.0;
          auVar60 = vsubps_avx(auVar93,auVar171);
          fVar199 = *pfVar2 * 0.0;
          fVar201 = pfVar2[1] * 0.0;
          fVar206 = pfVar2[2] * 0.0;
          fVar208 = pfVar2[3] * 0.0;
          fVar129 = fVar199 + fVar71 * 0.0;
          fVar164 = fVar201 + fVar202 * 0.0;
          fVar178 = fVar206 + fVar92 * 0.0;
          fVar179 = fVar208 + fVar192 * 0.0;
          fVar210 = *pfVar1 * 0.0;
          fVar215 = pfVar1[1] * 0.0;
          fVar217 = pfVar1[2] * 0.0;
          fVar218 = pfVar1[3] * 0.0;
          auVar220._0_4_ = fVar210 + fVar129 + fVar72;
          auVar220._4_4_ = fVar215 + fVar164 + fVar55;
          auVar220._8_4_ = fVar217 + fVar178 + fVar69;
          auVar220._12_4_ = fVar218 + fVar179 + fVar70;
          auVar109._0_4_ = fVar129 + *pfVar1 * 3.0;
          auVar109._4_4_ = fVar164 + pfVar1[1] * 3.0;
          auVar109._8_4_ = fVar178 + pfVar1[2] * 3.0;
          auVar109._12_4_ = fVar179 + pfVar1[3] * 3.0;
          auVar172._0_4_ = fVar72 * 3.0;
          auVar172._4_4_ = fVar55 * 3.0;
          auVar172._8_4_ = fVar69 * 3.0;
          auVar172._12_4_ = fVar70 * 3.0;
          auVar58 = vsubps_avx(auVar109,auVar172);
          auVar61._0_4_ = fVar195 * 0.0;
          auVar61._4_4_ = fVar197 * 0.0;
          auVar61._8_4_ = fVar118 * 0.0;
          auVar61._12_4_ = fVar128 * 0.0;
          auVar110._0_4_ = auVar61._0_4_ + fVar190 + fVar180 + fVar56;
          auVar110._4_4_ = auVar61._4_4_ + fVar191 + fVar181 + fVar35;
          auVar110._8_4_ = auVar61._8_4_ + fVar194 + fVar186 + fVar53;
          auVar110._12_4_ = auVar61._12_4_ + fVar196 + fVar188 + fVar54;
          auVar120._0_4_ = fVar56 * 3.0;
          auVar120._4_4_ = fVar35 * 3.0;
          auVar120._8_4_ = fVar53 * 3.0;
          auVar120._12_4_ = fVar54 * 3.0;
          auVar80._0_4_ = auVar57._0_4_ * 3.0;
          auVar80._4_4_ = auVar57._4_4_ * 3.0;
          auVar80._8_4_ = auVar57._8_4_ * 3.0;
          auVar80._12_4_ = auVar57._12_4_ * 3.0;
          auVar36 = vsubps_avx(auVar120,auVar80);
          auVar81._0_4_ = fVar190 + auVar36._0_4_;
          auVar81._4_4_ = fVar191 + auVar36._4_4_;
          auVar81._8_4_ = fVar194 + auVar36._8_4_;
          auVar81._12_4_ = fVar196 + auVar36._12_4_;
          auVar79 = vsubps_avx(auVar81,auVar61);
          auVar82._0_4_ = fVar72 * 0.0;
          auVar82._4_4_ = fVar55 * 0.0;
          auVar82._8_4_ = fVar69 * 0.0;
          auVar82._12_4_ = fVar70 * 0.0;
          auVar62._0_4_ = auVar82._0_4_ + fVar210 + fVar199 + fVar71;
          auVar62._4_4_ = auVar82._4_4_ + fVar215 + fVar201 + fVar202;
          auVar62._8_4_ = auVar82._8_4_ + fVar217 + fVar206 + fVar92;
          auVar62._12_4_ = auVar82._12_4_ + fVar218 + fVar208 + fVar192;
          auVar133._0_4_ = fVar71 * 3.0;
          auVar133._4_4_ = fVar202 * 3.0;
          auVar133._8_4_ = fVar92 * 3.0;
          auVar133._12_4_ = fVar192 * 3.0;
          auVar143._0_4_ = *pfVar2 * 3.0;
          auVar143._4_4_ = pfVar2[1] * 3.0;
          auVar143._8_4_ = pfVar2[2] * 3.0;
          auVar143._12_4_ = pfVar2[3] * 3.0;
          auVar36 = vsubps_avx(auVar133,auVar143);
          auVar134._0_4_ = fVar210 + auVar36._0_4_;
          auVar134._4_4_ = fVar215 + auVar36._4_4_;
          auVar134._8_4_ = fVar217 + auVar36._8_4_;
          auVar134._12_4_ = fVar218 + auVar36._12_4_;
          auVar37 = vsubps_avx(auVar134,auVar82);
          auVar36 = vshufps_avx(auVar60,auVar60,0xc9);
          auVar73 = vshufps_avx(auVar220,auVar220,0xc9);
          fVar180 = auVar60._0_4_;
          auVar144._0_4_ = fVar180 * auVar73._0_4_;
          fVar181 = auVar60._4_4_;
          auVar144._4_4_ = fVar181 * auVar73._4_4_;
          fVar186 = auVar60._8_4_;
          auVar144._8_4_ = fVar186 * auVar73._8_4_;
          fVar188 = auVar60._12_4_;
          auVar144._12_4_ = fVar188 * auVar73._12_4_;
          auVar154._0_4_ = auVar220._0_4_ * auVar36._0_4_;
          auVar154._4_4_ = auVar220._4_4_ * auVar36._4_4_;
          auVar154._8_4_ = auVar220._8_4_ * auVar36._8_4_;
          auVar154._12_4_ = auVar220._12_4_ * auVar36._12_4_;
          auVar73 = vsubps_avx(auVar154,auVar144);
          auVar57 = vshufps_avx(auVar73,auVar73,0xc9);
          auVar73 = vshufps_avx(auVar58,auVar58,0xc9);
          auVar155._0_4_ = auVar73._0_4_ * fVar180;
          auVar155._4_4_ = auVar73._4_4_ * fVar181;
          auVar155._8_4_ = auVar73._8_4_ * fVar186;
          auVar155._12_4_ = auVar73._12_4_ * fVar188;
          auVar135._0_4_ = auVar58._0_4_ * auVar36._0_4_;
          auVar135._4_4_ = auVar58._4_4_ * auVar36._4_4_;
          auVar135._8_4_ = auVar58._8_4_ * auVar36._8_4_;
          auVar135._12_4_ = auVar58._12_4_ * auVar36._12_4_;
          auVar36 = vsubps_avx(auVar135,auVar155);
          auVar58 = vshufps_avx(auVar36,auVar36,0xc9);
          auVar36 = vshufps_avx(auVar79,auVar79,0xc9);
          auVar73 = vshufps_avx(auVar62,auVar62,0xc9);
          fVar56 = auVar79._0_4_;
          auVar173._0_4_ = auVar73._0_4_ * fVar56;
          fVar35 = auVar79._4_4_;
          auVar173._4_4_ = auVar73._4_4_ * fVar35;
          fVar53 = auVar79._8_4_;
          auVar173._8_4_ = auVar73._8_4_ * fVar53;
          fVar54 = auVar79._12_4_;
          auVar173._12_4_ = auVar73._12_4_ * fVar54;
          auVar63._0_4_ = auVar36._0_4_ * auVar62._0_4_;
          auVar63._4_4_ = auVar36._4_4_ * auVar62._4_4_;
          auVar63._8_4_ = auVar36._8_4_ * auVar62._8_4_;
          auVar63._12_4_ = auVar36._12_4_ * auVar62._12_4_;
          auVar73 = vsubps_avx(auVar63,auVar173);
          auVar150 = vshufps_avx(auVar73,auVar73,0xc9);
          auVar73 = vshufps_avx(auVar37,auVar37,0xc9);
          auVar174._0_4_ = auVar73._0_4_ * fVar56;
          auVar174._4_4_ = auVar73._4_4_ * fVar35;
          auVar174._8_4_ = auVar73._8_4_ * fVar53;
          auVar174._12_4_ = auVar73._12_4_ * fVar54;
          auVar83._0_4_ = auVar36._0_4_ * auVar37._0_4_;
          auVar83._4_4_ = auVar36._4_4_ * auVar37._4_4_;
          auVar83._8_4_ = auVar36._8_4_ * auVar37._8_4_;
          auVar83._12_4_ = auVar36._12_4_ * auVar37._12_4_;
          auVar73 = vsubps_avx(auVar83,auVar174);
          auVar36 = vdpps_avx(auVar57,auVar57,0x7f);
          auVar37 = vshufps_avx(auVar73,auVar73,0xc9);
          fVar71 = auVar36._0_4_;
          auVar184._4_12_ = ZEXT812(0) << 0x20;
          auVar184._0_4_ = fVar71;
          auVar73 = vrsqrtss_avx(auVar184,auVar184);
          fVar72 = auVar73._0_4_;
          auVar73 = vdpps_avx(auVar57,auVar58,0x7f);
          auVar38 = ZEXT416((uint)(fVar72 * 1.5 - fVar71 * 0.5 * fVar72 * fVar72 * fVar72));
          auVar38 = vshufps_avx(auVar38,auVar38,0);
          fVar72 = auVar38._0_4_ * auVar57._0_4_;
          fVar55 = auVar38._4_4_ * auVar57._4_4_;
          fVar69 = auVar38._8_4_ * auVar57._8_4_;
          fVar70 = auVar38._12_4_ * auVar57._12_4_;
          auVar36 = vshufps_avx(auVar36,auVar36,0);
          auVar156._0_4_ = auVar36._0_4_ * auVar58._0_4_;
          auVar156._4_4_ = auVar36._4_4_ * auVar58._4_4_;
          auVar156._8_4_ = auVar36._8_4_ * auVar58._8_4_;
          auVar156._12_4_ = auVar36._12_4_ * auVar58._12_4_;
          auVar36 = vshufps_avx(auVar73,auVar73,0);
          auVar145._0_4_ = auVar36._0_4_ * auVar57._0_4_;
          auVar145._4_4_ = auVar36._4_4_ * auVar57._4_4_;
          auVar145._8_4_ = auVar36._8_4_ * auVar57._8_4_;
          auVar145._12_4_ = auVar36._12_4_ * auVar57._12_4_;
          auVar39 = vsubps_avx(auVar156,auVar145);
          auVar73 = vrcpss_avx(auVar184,auVar184);
          auVar36 = vdpps_avx(auVar150,auVar150,0x7f);
          auVar73 = ZEXT416((uint)(auVar73._0_4_ * (2.0 - fVar71 * auVar73._0_4_)));
          auVar57 = vshufps_avx(auVar73,auVar73,0);
          fVar71 = auVar36._0_4_;
          auVar146._4_12_ = ZEXT812(0) << 0x20;
          auVar146._0_4_ = fVar71;
          auVar73 = vrsqrtss_avx(auVar146,auVar146);
          fVar202 = auVar73._0_4_;
          auVar73 = ZEXT416((uint)(fVar202 * 1.5 - fVar71 * 0.5 * fVar202 * fVar202 * fVar202));
          auVar58 = vshufps_avx(auVar73,auVar73,0);
          auVar73 = vdpps_avx(auVar150,auVar37,0x7f);
          fVar202 = auVar58._0_4_ * auVar150._0_4_;
          fVar92 = auVar58._4_4_ * auVar150._4_4_;
          fVar192 = auVar58._8_4_ * auVar150._8_4_;
          fVar195 = auVar58._12_4_ * auVar150._12_4_;
          auVar36 = vshufps_avx(auVar36,auVar36,0);
          auVar136._0_4_ = auVar36._0_4_ * auVar37._0_4_;
          auVar136._4_4_ = auVar36._4_4_ * auVar37._4_4_;
          auVar136._8_4_ = auVar36._8_4_ * auVar37._8_4_;
          auVar136._12_4_ = auVar36._12_4_ * auVar37._12_4_;
          auVar36 = vshufps_avx(auVar73,auVar73,0);
          auVar64._0_4_ = auVar36._0_4_ * auVar150._0_4_;
          auVar64._4_4_ = auVar36._4_4_ * auVar150._4_4_;
          auVar64._8_4_ = auVar36._8_4_ * auVar150._8_4_;
          auVar64._12_4_ = auVar36._12_4_ * auVar150._12_4_;
          auVar37 = vsubps_avx(auVar136,auVar64);
          auVar36 = vrcpss_avx(auVar146,auVar146);
          auVar36 = ZEXT416((uint)(auVar36._0_4_ * (2.0 - fVar71 * auVar36._0_4_)));
          auVar36 = vshufps_avx(auVar36,auVar36,0);
          auVar21._4_4_ = fVar101;
          auVar21._0_4_ = fVar100;
          auVar21._8_4_ = fVar102;
          auVar21._12_4_ = fVar127;
          auVar73 = vshufps_avx(auVar21,auVar21,0xff);
          auVar175._0_4_ = auVar73._0_4_ * fVar72;
          auVar175._4_4_ = auVar73._4_4_ * fVar55;
          auVar175._8_4_ = auVar73._8_4_ * fVar69;
          auVar175._12_4_ = auVar73._12_4_ * fVar70;
          auVar40 = vsubps_avx(auVar21,auVar175);
          auVar150 = vshufps_avx(auVar60,auVar60,0xff);
          auVar137._0_4_ =
               auVar150._0_4_ * fVar72 +
               auVar38._0_4_ * auVar57._0_4_ * auVar39._0_4_ * auVar73._0_4_;
          auVar137._4_4_ =
               auVar150._4_4_ * fVar55 +
               auVar38._4_4_ * auVar57._4_4_ * auVar39._4_4_ * auVar73._4_4_;
          auVar137._8_4_ =
               auVar150._8_4_ * fVar69 +
               auVar38._8_4_ * auVar57._8_4_ * auVar39._8_4_ * auVar73._8_4_;
          auVar137._12_4_ =
               auVar150._12_4_ * fVar70 +
               auVar38._12_4_ * auVar57._12_4_ * auVar39._12_4_ * auVar73._12_4_;
          auVar150 = vsubps_avx(auVar60,auVar137);
          fVar100 = auVar175._0_4_ + fVar100;
          fVar101 = auVar175._4_4_ + fVar101;
          fVar102 = auVar175._8_4_ + fVar102;
          fVar127 = auVar175._12_4_ + fVar127;
          auVar73 = vshufps_avx(auVar110,auVar110,0xff);
          auVar94._0_4_ = fVar202 * auVar73._0_4_;
          auVar94._4_4_ = fVar92 * auVar73._4_4_;
          auVar94._8_4_ = fVar192 * auVar73._8_4_;
          auVar94._12_4_ = fVar195 * auVar73._12_4_;
          auVar38 = vsubps_avx(auVar110,auVar94);
          auVar57 = vshufps_avx(auVar79,auVar79,0xff);
          auVar43._0_4_ =
               auVar57._0_4_ * fVar202 +
               auVar73._0_4_ * auVar58._0_4_ * auVar37._0_4_ * auVar36._0_4_;
          auVar43._4_4_ =
               auVar57._4_4_ * fVar92 +
               auVar73._4_4_ * auVar58._4_4_ * auVar37._4_4_ * auVar36._4_4_;
          auVar43._8_4_ =
               auVar57._8_4_ * fVar192 +
               auVar73._8_4_ * auVar58._8_4_ * auVar37._8_4_ * auVar36._8_4_;
          auVar43._12_4_ =
               auVar57._12_4_ * fVar195 +
               auVar73._12_4_ * auVar58._12_4_ * auVar37._12_4_ * auVar36._12_4_;
          auVar36 = vsubps_avx(auVar79,auVar43);
          auVar44._0_4_ = auVar36._0_4_ * 0.33333334;
          auVar44._4_4_ = auVar36._4_4_ * 0.33333334;
          auVar44._8_4_ = auVar36._8_4_ * 0.33333334;
          auVar44._12_4_ = auVar36._12_4_ * 0.33333334;
          auVar37 = vsubps_avx(auVar38,auVar44);
          auVar36 = vshufps_avx(auVar37,auVar37,0);
          auVar73 = vshufps_avx(auVar37,auVar37,0x55);
          auVar57 = vshufps_avx(auVar38,auVar38,0);
          auVar58 = vshufps_avx(auVar38,auVar38,0x55);
          fVar187 = auVar57._0_4_;
          fVar189 = auVar57._4_4_;
          fVar198 = auVar57._8_4_;
          fVar200 = auVar57._12_4_;
          fVar72 = auVar36._0_4_;
          fVar69 = auVar36._4_4_;
          fVar71 = auVar36._8_4_;
          fVar92 = auVar36._12_4_;
          fVar161 = auVar58._0_4_;
          fVar162 = auVar58._4_4_;
          fVar163 = auVar58._8_4_;
          fVar182 = auVar58._12_4_;
          fVar55 = auVar73._0_4_;
          fVar70 = auVar73._4_4_;
          fVar202 = auVar73._8_4_;
          fVar192 = auVar73._12_4_;
          auVar36 = vshufps_avx(auVar37,auVar37,0xaa);
          auVar73 = vshufps_avx(auVar38,auVar38,0xaa);
          fVar222 = auVar73._0_4_;
          fVar223 = auVar73._4_4_;
          fVar227 = auVar73._8_4_;
          fVar203 = auVar36._0_4_;
          fVar207 = auVar36._4_4_;
          fVar209 = auVar36._8_4_;
          fVar211 = auVar36._12_4_;
          auVar121._0_4_ = auVar40._0_4_ + auVar150._0_4_ * 0.33333334;
          auVar121._4_4_ = auVar40._4_4_ + auVar150._4_4_ * 0.33333334;
          auVar121._8_4_ = auVar40._8_4_ + auVar150._8_4_ * 0.33333334;
          auVar121._12_4_ = auVar40._12_4_ + auVar150._12_4_ * 0.33333334;
          auVar36 = vshufps_avx(auVar121,auVar121,0);
          fVar210 = auVar36._0_4_;
          fVar215 = auVar36._4_4_;
          fVar217 = auVar36._8_4_;
          fVar218 = auVar36._12_4_;
          auVar36 = vshufps_avx(auVar121,auVar121,0x55);
          fVar199 = auVar36._0_4_;
          fVar201 = auVar36._4_4_;
          fVar206 = auVar36._8_4_;
          fVar208 = auVar36._12_4_;
          auVar36 = vshufps_avx(auVar121,auVar121,0xaa);
          fVar190 = auVar36._0_4_;
          fVar191 = auVar36._4_4_;
          fVar194 = auVar36._8_4_;
          fVar196 = auVar36._12_4_;
          auVar36 = vshufps_avx(auVar40,auVar40,0);
          fVar216 = auVar36._0_4_;
          fVar219 = auVar36._4_4_;
          fVar221 = auVar36._8_4_;
          auVar98._0_4_ =
               fVar216 * (float)bezier_basis0._476_4_ +
               fVar210 * (float)bezier_basis0._1632_4_ +
               (float)bezier_basis0._2788_4_ * fVar72 + fVar187 * (float)bezier_basis0._3944_4_;
          auVar98._4_4_ =
               fVar219 * (float)bezier_basis0._480_4_ +
               fVar215 * (float)bezier_basis0._1636_4_ +
               (float)bezier_basis0._2792_4_ * fVar69 + fVar189 * (float)bezier_basis0._3948_4_;
          auVar98._8_4_ =
               fVar221 * (float)bezier_basis0._484_4_ +
               fVar217 * (float)bezier_basis0._1640_4_ +
               (float)bezier_basis0._2796_4_ * fVar71 + fVar198 * (float)bezier_basis0._3952_4_;
          auVar98._12_4_ =
               auVar36._12_4_ * (float)bezier_basis0._488_4_ +
               fVar218 * (float)bezier_basis0._1644_4_ +
               (float)bezier_basis0._2800_4_ * fVar92 + fVar200 * (float)bezier_basis0._3956_4_;
          auVar98._16_4_ =
               fVar216 * (float)bezier_basis0._492_4_ +
               fVar210 * (float)bezier_basis0._1648_4_ +
               (float)bezier_basis0._2804_4_ * fVar72 + fVar187 * (float)bezier_basis0._3960_4_;
          auVar98._20_4_ =
               fVar219 * (float)bezier_basis0._496_4_ +
               fVar215 * (float)bezier_basis0._1652_4_ +
               (float)bezier_basis0._2808_4_ * fVar69 + fVar189 * (float)bezier_basis0._3964_4_;
          auVar98._24_4_ =
               fVar221 * (float)bezier_basis0._500_4_ +
               fVar217 * (float)bezier_basis0._1656_4_ +
               (float)bezier_basis0._2812_4_ * fVar71 + fVar198 * (float)bezier_basis0._3968_4_;
          auVar98._28_4_ = (float)bezier_basis0._3972_4_ + 0.0 + fVar92 + 0.0 + 0.0;
          auVar57 = vshufps_avx(auVar40,auVar40,0x55);
          fVar164 = auVar57._0_4_;
          fVar178 = auVar57._4_4_;
          fVar179 = auVar57._8_4_;
          auVar124._0_4_ =
               fVar199 * (float)bezier_basis0._1632_4_ +
               (float)bezier_basis0._2788_4_ * fVar55 + fVar161 * (float)bezier_basis0._3944_4_ +
               fVar164 * (float)bezier_basis0._476_4_;
          auVar124._4_4_ =
               fVar201 * (float)bezier_basis0._1636_4_ +
               (float)bezier_basis0._2792_4_ * fVar70 + fVar162 * (float)bezier_basis0._3948_4_ +
               fVar178 * (float)bezier_basis0._480_4_;
          auVar124._8_4_ =
               fVar206 * (float)bezier_basis0._1640_4_ +
               (float)bezier_basis0._2796_4_ * fVar202 + fVar163 * (float)bezier_basis0._3952_4_ +
               fVar179 * (float)bezier_basis0._484_4_;
          auVar124._12_4_ =
               fVar208 * (float)bezier_basis0._1644_4_ +
               (float)bezier_basis0._2800_4_ * fVar192 + fVar182 * (float)bezier_basis0._3956_4_ +
               auVar57._12_4_ * (float)bezier_basis0._488_4_;
          auVar124._16_4_ =
               fVar199 * (float)bezier_basis0._1648_4_ +
               (float)bezier_basis0._2804_4_ * fVar55 + fVar161 * (float)bezier_basis0._3960_4_ +
               fVar164 * (float)bezier_basis0._492_4_;
          auVar124._20_4_ =
               fVar201 * (float)bezier_basis0._1652_4_ +
               (float)bezier_basis0._2808_4_ * fVar70 + fVar162 * (float)bezier_basis0._3964_4_ +
               fVar178 * (float)bezier_basis0._496_4_;
          auVar124._24_4_ =
               fVar206 * (float)bezier_basis0._1656_4_ +
               (float)bezier_basis0._2812_4_ * fVar202 + fVar163 * (float)bezier_basis0._3968_4_ +
               fVar179 * (float)bezier_basis0._500_4_;
          auVar124._28_4_ = fVar192 + fVar92 + 0.0 + 0.0;
          auVar58 = vshufps_avx(auVar40,auVar40,0xaa);
          fVar195 = auVar58._0_4_;
          fVar197 = auVar58._4_4_;
          fVar118 = auVar58._8_4_;
          fVar128 = auVar58._12_4_;
          auVar148._0_4_ =
               fVar195 * (float)bezier_basis0._476_4_ +
               fVar190 * (float)bezier_basis0._1632_4_ +
               fVar203 * (float)bezier_basis0._2788_4_ + fVar222 * (float)bezier_basis0._3944_4_;
          auVar148._4_4_ =
               fVar197 * (float)bezier_basis0._480_4_ +
               fVar191 * (float)bezier_basis0._1636_4_ +
               fVar207 * (float)bezier_basis0._2792_4_ + fVar223 * (float)bezier_basis0._3948_4_;
          auVar148._8_4_ =
               fVar118 * (float)bezier_basis0._484_4_ +
               fVar194 * (float)bezier_basis0._1640_4_ +
               fVar209 * (float)bezier_basis0._2796_4_ + fVar227 * (float)bezier_basis0._3952_4_;
          auVar148._12_4_ =
               fVar128 * (float)bezier_basis0._488_4_ +
               fVar196 * (float)bezier_basis0._1644_4_ +
               fVar211 * (float)bezier_basis0._2800_4_ +
               auVar73._12_4_ * (float)bezier_basis0._3956_4_;
          auVar148._16_4_ =
               fVar195 * (float)bezier_basis0._492_4_ +
               fVar190 * (float)bezier_basis0._1648_4_ +
               fVar203 * (float)bezier_basis0._2804_4_ + fVar222 * (float)bezier_basis0._3960_4_;
          auVar148._20_4_ =
               fVar197 * (float)bezier_basis0._496_4_ +
               fVar191 * (float)bezier_basis0._1652_4_ +
               fVar207 * (float)bezier_basis0._2808_4_ + fVar223 * (float)bezier_basis0._3964_4_;
          auVar148._24_4_ =
               fVar118 * (float)bezier_basis0._500_4_ +
               fVar194 * (float)bezier_basis0._1656_4_ +
               fVar209 * (float)bezier_basis0._2812_4_ + fVar227 * (float)bezier_basis0._3968_4_;
          auVar148._28_4_ = (float)bezier_basis0._3972_4_ + 0.0 + 0.0 + 0.0;
          fVar129 = fVar218 + fVar200 + (float)bezier_basis0._504_4_;
          auVar114._0_4_ =
               fVar216 * (float)bezier_basis0._5100_4_ +
               fVar210 * (float)bezier_basis0._6256_4_ +
               (float)bezier_basis0._7412_4_ * fVar72 + fVar187 * (float)bezier_basis0._8568_4_;
          auVar114._4_4_ =
               fVar219 * (float)bezier_basis0._5104_4_ +
               fVar215 * (float)bezier_basis0._6260_4_ +
               (float)bezier_basis0._7416_4_ * fVar69 + fVar189 * (float)bezier_basis0._8572_4_;
          auVar114._8_4_ =
               fVar221 * (float)bezier_basis0._5108_4_ +
               fVar217 * (float)bezier_basis0._6264_4_ +
               (float)bezier_basis0._7420_4_ * fVar71 + fVar198 * (float)bezier_basis0._8576_4_;
          auVar114._12_4_ =
               auVar36._12_4_ * (float)bezier_basis0._5112_4_ +
               fVar218 * (float)bezier_basis0._6268_4_ +
               (float)bezier_basis0._7424_4_ * fVar92 + fVar200 * (float)bezier_basis0._8580_4_;
          auVar114._16_4_ =
               fVar216 * (float)bezier_basis0._5116_4_ +
               fVar210 * (float)bezier_basis0._6272_4_ +
               (float)bezier_basis0._7428_4_ * fVar72 + fVar187 * (float)bezier_basis0._8584_4_;
          auVar114._20_4_ =
               fVar219 * (float)bezier_basis0._5120_4_ +
               fVar215 * (float)bezier_basis0._6276_4_ +
               (float)bezier_basis0._7432_4_ * fVar69 + fVar189 * (float)bezier_basis0._8588_4_;
          auVar114._24_4_ =
               fVar221 * (float)bezier_basis0._5124_4_ +
               fVar217 * (float)bezier_basis0._6280_4_ +
               (float)bezier_basis0._7436_4_ * fVar71 + fVar198 * (float)bezier_basis0._8592_4_;
          auVar114._28_4_ = (float)bezier_basis0._6284_4_ + fVar129;
          auVar87._0_4_ =
               fVar199 * (float)bezier_basis0._6256_4_ +
               (float)bezier_basis0._7412_4_ * fVar55 + fVar161 * (float)bezier_basis0._8568_4_ +
               fVar164 * (float)bezier_basis0._5100_4_;
          auVar87._4_4_ =
               fVar201 * (float)bezier_basis0._6260_4_ +
               (float)bezier_basis0._7416_4_ * fVar70 + fVar162 * (float)bezier_basis0._8572_4_ +
               fVar178 * (float)bezier_basis0._5104_4_;
          auVar87._8_4_ =
               fVar206 * (float)bezier_basis0._6264_4_ +
               (float)bezier_basis0._7420_4_ * fVar202 + fVar163 * (float)bezier_basis0._8576_4_ +
               fVar179 * (float)bezier_basis0._5108_4_;
          auVar87._12_4_ =
               fVar208 * (float)bezier_basis0._6268_4_ +
               (float)bezier_basis0._7424_4_ * fVar192 + fVar182 * (float)bezier_basis0._8580_4_ +
               auVar57._12_4_ * (float)bezier_basis0._5112_4_;
          auVar87._16_4_ =
               fVar199 * (float)bezier_basis0._6272_4_ +
               (float)bezier_basis0._7428_4_ * fVar55 + fVar161 * (float)bezier_basis0._8584_4_ +
               fVar164 * (float)bezier_basis0._5116_4_;
          auVar87._20_4_ =
               fVar201 * (float)bezier_basis0._6276_4_ +
               (float)bezier_basis0._7432_4_ * fVar70 + fVar162 * (float)bezier_basis0._8588_4_ +
               fVar178 * (float)bezier_basis0._5120_4_;
          auVar87._24_4_ =
               fVar206 * (float)bezier_basis0._6280_4_ +
               (float)bezier_basis0._7436_4_ * fVar202 + fVar163 * (float)bezier_basis0._8592_4_ +
               fVar179 * (float)bezier_basis0._5124_4_;
          auVar87._28_4_ = fVar208 + fVar200 + fVar182 + fVar129;
          auVar49._0_4_ =
               fVar203 * (float)bezier_basis0._7412_4_ + fVar222 * (float)bezier_basis0._8568_4_ +
               fVar190 * (float)bezier_basis0._6256_4_ + fVar195 * (float)bezier_basis0._5100_4_;
          auVar49._4_4_ =
               fVar207 * (float)bezier_basis0._7416_4_ + fVar223 * (float)bezier_basis0._8572_4_ +
               fVar191 * (float)bezier_basis0._6260_4_ + fVar197 * (float)bezier_basis0._5104_4_;
          auVar49._8_4_ =
               fVar209 * (float)bezier_basis0._7420_4_ + fVar227 * (float)bezier_basis0._8576_4_ +
               fVar194 * (float)bezier_basis0._6264_4_ + fVar118 * (float)bezier_basis0._5108_4_;
          auVar49._12_4_ =
               fVar211 * (float)bezier_basis0._7424_4_ +
               auVar73._12_4_ * (float)bezier_basis0._8580_4_ +
               fVar196 * (float)bezier_basis0._6268_4_ + fVar128 * (float)bezier_basis0._5112_4_;
          auVar49._16_4_ =
               fVar203 * (float)bezier_basis0._7428_4_ + fVar222 * (float)bezier_basis0._8584_4_ +
               fVar190 * (float)bezier_basis0._6272_4_ + fVar195 * (float)bezier_basis0._5116_4_;
          auVar49._20_4_ =
               fVar207 * (float)bezier_basis0._7432_4_ + fVar223 * (float)bezier_basis0._8588_4_ +
               fVar191 * (float)bezier_basis0._6276_4_ + fVar197 * (float)bezier_basis0._5120_4_;
          auVar49._24_4_ =
               fVar209 * (float)bezier_basis0._7436_4_ + fVar227 * (float)bezier_basis0._8592_4_ +
               fVar194 * (float)bezier_basis0._6280_4_ + fVar118 * (float)bezier_basis0._5124_4_;
          auVar49._28_4_ = fVar211 + fVar200 + fVar196 + fVar128;
          auVar157 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar10 = vblendps_avx(auVar114,auVar157,1);
          auVar14._4_4_ = auVar10._4_4_ * 0.055555556;
          auVar14._0_4_ = auVar10._0_4_ * 0.055555556;
          auVar14._8_4_ = auVar10._8_4_ * 0.055555556;
          auVar14._12_4_ = auVar10._12_4_ * 0.055555556;
          auVar14._16_4_ = auVar10._16_4_ * 0.055555556;
          auVar14._20_4_ = auVar10._20_4_ * 0.055555556;
          auVar14._24_4_ = auVar10._24_4_ * 0.055555556;
          auVar14._28_4_ = auVar10._28_4_;
          auVar185 = vsubps_avx(auVar98,auVar14);
          auVar10 = vblendps_avx(auVar114,auVar157,0x80);
          auVar115._0_4_ = auVar98._0_4_ + auVar10._0_4_ * 0.055555556;
          auVar115._4_4_ = auVar98._4_4_ + auVar10._4_4_ * 0.055555556;
          auVar115._8_4_ = auVar98._8_4_ + auVar10._8_4_ * 0.055555556;
          auVar115._12_4_ = auVar98._12_4_ + auVar10._12_4_ * 0.055555556;
          auVar115._16_4_ = auVar98._16_4_ + auVar10._16_4_ * 0.055555556;
          auVar115._20_4_ = auVar98._20_4_ + auVar10._20_4_ * 0.055555556;
          auVar115._24_4_ = auVar98._24_4_ + auVar10._24_4_ * 0.055555556;
          auVar115._28_4_ = auVar98._28_4_ + auVar10._28_4_;
          auVar139._8_4_ = 0x7f800000;
          auVar139._0_8_ = 0x7f8000007f800000;
          auVar139._12_4_ = 0x7f800000;
          auVar139._16_4_ = 0x7f800000;
          auVar139._20_4_ = 0x7f800000;
          auVar139._24_4_ = 0x7f800000;
          auVar139._28_4_ = 0x7f800000;
          auVar10 = vminps_avx(auVar139,auVar98);
          auVar157 = vminps_avx(auVar185,auVar115);
          auVar158 = vminps_avx(auVar10,auVar157);
          auVar204 = ZEXT1232(ZEXT412(0)) << 0x20;
          auVar10 = vblendps_avx(auVar87,auVar204,1);
          auVar15._4_4_ = auVar10._4_4_ * 0.055555556;
          auVar15._0_4_ = auVar10._0_4_ * 0.055555556;
          auVar15._8_4_ = auVar10._8_4_ * 0.055555556;
          auVar15._12_4_ = auVar10._12_4_ * 0.055555556;
          auVar15._16_4_ = auVar10._16_4_ * 0.055555556;
          auVar15._20_4_ = auVar10._20_4_ * 0.055555556;
          auVar15._24_4_ = auVar10._24_4_ * 0.055555556;
          auVar15._28_4_ = auVar10._28_4_;
          auVar177 = vsubps_avx(auVar124,auVar15);
          auVar10 = vblendps_avx(auVar87,auVar204,0x80);
          auVar88._0_4_ = auVar124._0_4_ + auVar10._0_4_ * 0.055555556;
          auVar88._4_4_ = auVar124._4_4_ + auVar10._4_4_ * 0.055555556;
          auVar88._8_4_ = auVar124._8_4_ + auVar10._8_4_ * 0.055555556;
          auVar88._12_4_ = auVar124._12_4_ + auVar10._12_4_ * 0.055555556;
          auVar88._16_4_ = auVar124._16_4_ + auVar10._16_4_ * 0.055555556;
          auVar88._20_4_ = auVar124._20_4_ + auVar10._20_4_ * 0.055555556;
          auVar88._24_4_ = auVar124._24_4_ + auVar10._24_4_ * 0.055555556;
          auVar88._28_4_ = auVar124._28_4_ + auVar10._28_4_;
          auVar10 = vminps_avx(auVar139,auVar124);
          auVar157 = vminps_avx(auVar177,auVar88);
          auVar13 = vminps_avx(auVar10,auVar157);
          auVar10 = vblendps_avx(auVar49,auVar204,1);
          auVar16._4_4_ = auVar10._4_4_ * 0.055555556;
          auVar16._0_4_ = auVar10._0_4_ * 0.055555556;
          auVar16._8_4_ = auVar10._8_4_ * 0.055555556;
          auVar16._12_4_ = auVar10._12_4_ * 0.055555556;
          auVar16._16_4_ = auVar10._16_4_ * 0.055555556;
          auVar16._20_4_ = auVar10._20_4_ * 0.055555556;
          auVar16._24_4_ = auVar10._24_4_ * 0.055555556;
          auVar16._28_4_ = auVar10._28_4_;
          auVar97 = vsubps_avx(auVar148,auVar16);
          auVar10 = vblendps_avx(auVar49,auVar204,0x80);
          auVar205._0_4_ = auVar148._0_4_ + auVar10._0_4_ * 0.055555556;
          auVar205._4_4_ = auVar148._4_4_ + auVar10._4_4_ * 0.055555556;
          auVar205._8_4_ = auVar148._8_4_ + auVar10._8_4_ * 0.055555556;
          auVar205._12_4_ = auVar148._12_4_ + auVar10._12_4_ * 0.055555556;
          auVar205._16_4_ = auVar148._16_4_ + auVar10._16_4_ * 0.055555556;
          auVar205._20_4_ = auVar148._20_4_ + auVar10._20_4_ * 0.055555556;
          auVar205._24_4_ = auVar148._24_4_ + auVar10._24_4_ * 0.055555556;
          auVar205._28_4_ = auVar148._28_4_ + auVar10._28_4_;
          auVar10 = vminps_avx(auVar139,auVar148);
          auVar157 = vminps_avx(auVar97,auVar205);
          auVar204 = vminps_avx(auVar10,auVar157);
          auVar10 = vmaxps_avx(auVar185,auVar115);
          auVar116._8_4_ = 0xff800000;
          auVar116._0_8_ = 0xff800000ff800000;
          auVar116._12_4_ = 0xff800000;
          auVar116._16_4_ = 0xff800000;
          auVar116._20_4_ = 0xff800000;
          auVar116._24_4_ = 0xff800000;
          auVar116._28_4_ = 0xff800000;
          auVar157 = vmaxps_avx(auVar116,auVar98);
          auVar10 = vmaxps_avx(auVar157,auVar10);
          auVar157 = vmaxps_avx(auVar177,auVar88);
          auVar185 = vmaxps_avx(auVar116,auVar124);
          auVar157 = vmaxps_avx(auVar185,auVar157);
          auVar185 = vmaxps_avx(auVar97,auVar205);
          auVar177 = vmaxps_avx(auVar116,auVar148);
          auVar185 = vmaxps_avx(auVar177,auVar185);
          auVar177 = vshufps_avx(auVar158,auVar158,0xb1);
          auVar177 = vminps_avx(auVar158,auVar177);
          auVar158 = vshufpd_avx(auVar177,auVar177,5);
          auVar177 = vminps_avx(auVar177,auVar158);
          auVar36 = vminps_avx(auVar177._0_16_,auVar177._16_16_);
          auVar177 = vshufps_avx(auVar13,auVar13,0xb1);
          auVar177 = vminps_avx(auVar13,auVar177);
          auVar158 = vshufpd_avx(auVar177,auVar177,5);
          auVar177 = vminps_avx(auVar177,auVar158);
          auVar73 = vminps_avx(auVar177._0_16_,auVar177._16_16_);
          auVar73 = vunpcklps_avx(auVar36,auVar73);
          auVar177 = vshufps_avx(auVar204,auVar204,0xb1);
          auVar177 = vminps_avx(auVar204,auVar177);
          auVar158 = vshufpd_avx(auVar177,auVar177,5);
          auVar177 = vminps_avx(auVar177,auVar158);
          auVar36 = vminps_avx(auVar177._0_16_,auVar177._16_16_);
          auVar36 = vinsertps_avx(auVar73,auVar36,0x28);
          auVar177 = vshufps_avx(auVar10,auVar10,0xb1);
          auVar10 = vmaxps_avx(auVar10,auVar177);
          auVar177 = vshufpd_avx(auVar10,auVar10,5);
          auVar10 = vmaxps_avx(auVar10,auVar177);
          auVar73 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
          auVar10 = vshufps_avx(auVar157,auVar157,0xb1);
          auVar10 = vmaxps_avx(auVar157,auVar10);
          auVar157 = vshufpd_avx(auVar10,auVar10,5);
          auVar10 = vmaxps_avx(auVar10,auVar157);
          auVar57 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
          auVar95._0_4_ = (fVar56 + auVar43._0_4_) * 0.33333334;
          auVar95._4_4_ = (fVar35 + auVar43._4_4_) * 0.33333334;
          auVar95._8_4_ = (fVar53 + auVar43._8_4_) * 0.33333334;
          auVar95._12_4_ = (fVar54 + auVar43._12_4_) * 0.33333334;
          auVar23._4_4_ = auVar110._4_4_ + auVar94._4_4_;
          auVar23._0_4_ = auVar110._0_4_ + auVar94._0_4_;
          auVar23._8_4_ = auVar110._8_4_ + auVar94._8_4_;
          auVar23._12_4_ = auVar110._12_4_ + auVar94._12_4_;
          auVar150 = vsubps_avx(auVar23,auVar95);
          auVar57 = vunpcklps_avx(auVar73,auVar57);
          auVar10 = vshufps_avx(auVar185,auVar185,0xb1);
          auVar10 = vmaxps_avx(auVar185,auVar10);
          auVar157 = vshufpd_avx(auVar10,auVar10,5);
          auVar10 = vmaxps_avx(auVar10,auVar157);
          auVar73 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
          auVar73 = vinsertps_avx(auVar57,auVar73,0x28);
          auVar57 = vshufps_avx(auVar150,auVar150,0);
          auVar58 = vshufps_avx(auVar23,auVar23,0);
          fVar210 = auVar58._0_4_;
          fVar215 = auVar58._4_4_;
          fVar217 = auVar58._8_4_;
          fVar218 = auVar58._12_4_;
          fVar56 = auVar57._0_4_;
          fVar35 = auVar57._4_4_;
          fVar53 = auVar57._8_4_;
          fVar54 = auVar57._12_4_;
          auVar57 = vshufps_avx(auVar150,auVar150,0x55);
          auVar58 = vshufps_avx(auVar23,auVar23,0x55);
          fVar161 = auVar58._0_4_;
          fVar162 = auVar58._4_4_;
          fVar163 = auVar58._8_4_;
          fVar182 = auVar58._12_4_;
          fVar191 = auVar57._0_4_;
          fVar194 = auVar57._4_4_;
          fVar196 = auVar57._8_4_;
          fVar199 = auVar57._12_4_;
          auVar57 = vshufps_avx(auVar150,auVar150,0xaa);
          auVar58 = vshufps_avx(auVar23,auVar23,0xaa);
          fVar164 = auVar58._0_4_;
          fVar178 = auVar58._4_4_;
          fVar179 = auVar58._8_4_;
          fVar190 = auVar58._12_4_;
          fVar197 = auVar57._0_4_;
          fVar118 = auVar57._4_4_;
          fVar128 = auVar57._8_4_;
          fVar129 = auVar57._12_4_;
          auVar22._4_4_ = fVar101;
          auVar22._0_4_ = fVar100;
          auVar22._8_4_ = fVar102;
          auVar22._12_4_ = fVar127;
          auVar111._0_4_ = fVar100 + (fVar180 + auVar137._0_4_) * 0.33333334;
          auVar111._4_4_ = fVar101 + (fVar181 + auVar137._4_4_) * 0.33333334;
          auVar111._8_4_ = fVar102 + (fVar186 + auVar137._8_4_) * 0.33333334;
          auVar111._12_4_ = fVar127 + (fVar188 + auVar137._12_4_) * 0.33333334;
          auVar57 = vshufps_avx(auVar111,auVar111,0);
          fVar70 = auVar57._0_4_;
          fVar202 = auVar57._4_4_;
          fVar192 = auVar57._8_4_;
          auVar58 = vshufps_avx(auVar111,auVar111,0x55);
          fVar181 = auVar58._0_4_;
          fVar186 = auVar58._4_4_;
          fVar188 = auVar58._8_4_;
          auVar150 = vshufps_avx(auVar111,auVar111,0xaa);
          fVar201 = auVar150._0_4_;
          fVar206 = auVar150._4_4_;
          fVar208 = auVar150._8_4_;
          fVar101 = (float)bezier_basis0._2816_4_ + 0.0 + 0.0;
          auVar37 = vshufps_avx(auVar22,auVar22,0);
          fVar102 = auVar37._0_4_;
          fVar127 = auVar37._4_4_;
          fVar180 = auVar37._8_4_;
          auVar226._0_4_ =
               fVar102 * (float)bezier_basis0._476_4_ +
               fVar70 * (float)bezier_basis0._1632_4_ +
               fVar56 * (float)bezier_basis0._2788_4_ + fVar210 * (float)bezier_basis0._3944_4_;
          auVar226._4_4_ =
               fVar127 * (float)bezier_basis0._480_4_ +
               fVar202 * (float)bezier_basis0._1636_4_ +
               fVar35 * (float)bezier_basis0._2792_4_ + fVar215 * (float)bezier_basis0._3948_4_;
          auVar226._8_4_ =
               fVar180 * (float)bezier_basis0._484_4_ +
               fVar192 * (float)bezier_basis0._1640_4_ +
               fVar53 * (float)bezier_basis0._2796_4_ + fVar217 * (float)bezier_basis0._3952_4_;
          auVar226._12_4_ =
               auVar37._12_4_ * (float)bezier_basis0._488_4_ +
               auVar57._12_4_ * (float)bezier_basis0._1644_4_ +
               fVar54 * (float)bezier_basis0._2800_4_ + fVar218 * (float)bezier_basis0._3956_4_;
          auVar226._16_4_ =
               fVar102 * (float)bezier_basis0._492_4_ +
               fVar70 * (float)bezier_basis0._1648_4_ +
               fVar56 * (float)bezier_basis0._2804_4_ + fVar210 * (float)bezier_basis0._3960_4_;
          auVar226._20_4_ =
               fVar127 * (float)bezier_basis0._496_4_ +
               fVar202 * (float)bezier_basis0._1652_4_ +
               fVar35 * (float)bezier_basis0._2808_4_ + fVar215 * (float)bezier_basis0._3964_4_;
          auVar226._24_4_ =
               fVar180 * (float)bezier_basis0._500_4_ +
               fVar192 * (float)bezier_basis0._1656_4_ +
               fVar53 * (float)bezier_basis0._2812_4_ + fVar217 * (float)bezier_basis0._3968_4_;
          auVar226._28_4_ = auVar97._28_4_ + fVar54 + 0.0 + 0.0;
          auVar38 = vshufps_avx(auVar22,auVar22,0x55);
          fVar71 = auVar38._0_4_;
          fVar92 = auVar38._4_4_;
          fVar100 = auVar38._8_4_;
          fVar195 = auVar38._12_4_;
          auVar117._0_4_ =
               fVar71 * (float)bezier_basis0._476_4_ +
               fVar181 * (float)bezier_basis0._1632_4_ +
               fVar191 * (float)bezier_basis0._2788_4_ + fVar161 * (float)bezier_basis0._3944_4_;
          auVar117._4_4_ =
               fVar92 * (float)bezier_basis0._480_4_ +
               fVar186 * (float)bezier_basis0._1636_4_ +
               fVar194 * (float)bezier_basis0._2792_4_ + fVar162 * (float)bezier_basis0._3948_4_;
          auVar117._8_4_ =
               fVar100 * (float)bezier_basis0._484_4_ +
               fVar188 * (float)bezier_basis0._1640_4_ +
               fVar196 * (float)bezier_basis0._2796_4_ + fVar163 * (float)bezier_basis0._3952_4_;
          auVar117._12_4_ =
               fVar195 * (float)bezier_basis0._488_4_ +
               auVar58._12_4_ * (float)bezier_basis0._1644_4_ +
               fVar199 * (float)bezier_basis0._2800_4_ + fVar182 * (float)bezier_basis0._3956_4_;
          auVar117._16_4_ =
               fVar71 * (float)bezier_basis0._492_4_ +
               fVar181 * (float)bezier_basis0._1648_4_ +
               fVar191 * (float)bezier_basis0._2804_4_ + fVar161 * (float)bezier_basis0._3960_4_;
          auVar117._20_4_ =
               fVar92 * (float)bezier_basis0._496_4_ +
               fVar186 * (float)bezier_basis0._1652_4_ +
               fVar194 * (float)bezier_basis0._2808_4_ + fVar162 * (float)bezier_basis0._3964_4_;
          auVar117._24_4_ =
               fVar100 * (float)bezier_basis0._500_4_ +
               fVar188 * (float)bezier_basis0._1656_4_ +
               fVar196 * (float)bezier_basis0._2812_4_ + fVar163 * (float)bezier_basis0._3968_4_;
          auVar117._28_4_ = auVar205._28_4_ + (float)bezier_basis0._3972_4_ + 0.0 + 0.0;
          auVar38 = vshufps_avx(auVar22,auVar22,0xaa);
          fVar72 = auVar38._0_4_;
          fVar55 = auVar38._4_4_;
          fVar69 = auVar38._8_4_;
          auVar68._0_4_ =
               fVar72 * (float)bezier_basis0._476_4_ +
               fVar201 * (float)bezier_basis0._1632_4_ +
               fVar197 * (float)bezier_basis0._2788_4_ + fVar164 * (float)bezier_basis0._3944_4_;
          auVar68._4_4_ =
               fVar55 * (float)bezier_basis0._480_4_ +
               fVar206 * (float)bezier_basis0._1636_4_ +
               fVar118 * (float)bezier_basis0._2792_4_ + fVar178 * (float)bezier_basis0._3948_4_;
          auVar68._8_4_ =
               fVar69 * (float)bezier_basis0._484_4_ +
               fVar208 * (float)bezier_basis0._1640_4_ +
               fVar128 * (float)bezier_basis0._2796_4_ + fVar179 * (float)bezier_basis0._3952_4_;
          auVar68._12_4_ =
               auVar38._12_4_ * (float)bezier_basis0._488_4_ +
               auVar150._12_4_ * (float)bezier_basis0._1644_4_ +
               fVar129 * (float)bezier_basis0._2800_4_ + fVar190 * (float)bezier_basis0._3956_4_;
          auVar68._16_4_ =
               fVar72 * (float)bezier_basis0._492_4_ +
               fVar201 * (float)bezier_basis0._1648_4_ +
               fVar197 * (float)bezier_basis0._2804_4_ + fVar164 * (float)bezier_basis0._3960_4_;
          auVar68._20_4_ =
               fVar55 * (float)bezier_basis0._496_4_ +
               fVar206 * (float)bezier_basis0._1652_4_ +
               fVar118 * (float)bezier_basis0._2808_4_ + fVar178 * (float)bezier_basis0._3964_4_;
          auVar68._24_4_ =
               fVar69 * (float)bezier_basis0._500_4_ +
               fVar208 * (float)bezier_basis0._1656_4_ +
               fVar128 * (float)bezier_basis0._2812_4_ + fVar179 * (float)bezier_basis0._3968_4_;
          auVar68._28_4_ = fVar101 + 0.0;
          auVar89._0_4_ =
               fVar102 * (float)bezier_basis0._5100_4_ +
               (float)bezier_basis0._6256_4_ * fVar70 +
               (float)bezier_basis0._7412_4_ * fVar56 + fVar210 * (float)bezier_basis0._8568_4_;
          auVar89._4_4_ =
               fVar127 * (float)bezier_basis0._5104_4_ +
               (float)bezier_basis0._6260_4_ * fVar202 +
               (float)bezier_basis0._7416_4_ * fVar35 + fVar215 * (float)bezier_basis0._8572_4_;
          auVar89._8_4_ =
               fVar180 * (float)bezier_basis0._5108_4_ +
               (float)bezier_basis0._6264_4_ * fVar192 +
               (float)bezier_basis0._7420_4_ * fVar53 + fVar217 * (float)bezier_basis0._8576_4_;
          auVar89._12_4_ =
               auVar37._12_4_ * (float)bezier_basis0._5112_4_ +
               (float)bezier_basis0._6268_4_ * auVar57._12_4_ +
               (float)bezier_basis0._7424_4_ * fVar54 + fVar218 * (float)bezier_basis0._8580_4_;
          auVar89._16_4_ =
               fVar102 * (float)bezier_basis0._5116_4_ +
               (float)bezier_basis0._6272_4_ * fVar70 +
               (float)bezier_basis0._7428_4_ * fVar56 + fVar210 * (float)bezier_basis0._8584_4_;
          auVar89._20_4_ =
               fVar127 * (float)bezier_basis0._5120_4_ +
               (float)bezier_basis0._6276_4_ * fVar202 +
               (float)bezier_basis0._7432_4_ * fVar35 + fVar215 * (float)bezier_basis0._8588_4_;
          auVar89._24_4_ =
               fVar180 * (float)bezier_basis0._5124_4_ +
               (float)bezier_basis0._6280_4_ * fVar192 +
               (float)bezier_basis0._7436_4_ * fVar53 + fVar217 * (float)bezier_basis0._8592_4_;
          auVar89._28_4_ = fVar190 + fVar182 + fVar101 + 0.0;
          auVar125._0_4_ =
               fVar181 * (float)bezier_basis0._6256_4_ +
               fVar191 * (float)bezier_basis0._7412_4_ + fVar161 * (float)bezier_basis0._8568_4_ +
               fVar71 * (float)bezier_basis0._5100_4_;
          auVar125._4_4_ =
               fVar186 * (float)bezier_basis0._6260_4_ +
               fVar194 * (float)bezier_basis0._7416_4_ + fVar162 * (float)bezier_basis0._8572_4_ +
               fVar92 * (float)bezier_basis0._5104_4_;
          auVar125._8_4_ =
               fVar188 * (float)bezier_basis0._6264_4_ +
               fVar196 * (float)bezier_basis0._7420_4_ + fVar163 * (float)bezier_basis0._8576_4_ +
               fVar100 * (float)bezier_basis0._5108_4_;
          auVar125._12_4_ =
               auVar58._12_4_ * (float)bezier_basis0._6268_4_ +
               fVar199 * (float)bezier_basis0._7424_4_ + fVar182 * (float)bezier_basis0._8580_4_ +
               fVar195 * (float)bezier_basis0._5112_4_;
          auVar125._16_4_ =
               fVar181 * (float)bezier_basis0._6272_4_ +
               fVar191 * (float)bezier_basis0._7428_4_ + fVar161 * (float)bezier_basis0._8584_4_ +
               fVar71 * (float)bezier_basis0._5116_4_;
          auVar125._20_4_ =
               fVar186 * (float)bezier_basis0._6276_4_ +
               fVar194 * (float)bezier_basis0._7432_4_ + fVar162 * (float)bezier_basis0._8588_4_ +
               fVar92 * (float)bezier_basis0._5120_4_;
          auVar125._24_4_ =
               fVar188 * (float)bezier_basis0._6280_4_ +
               fVar196 * (float)bezier_basis0._7436_4_ + fVar163 * (float)bezier_basis0._8592_4_ +
               fVar100 * (float)bezier_basis0._5124_4_;
          auVar125._28_4_ = fVar190 + fVar199 + fVar218 + fVar195;
          auVar50._0_4_ =
               fVar72 * (float)bezier_basis0._5100_4_ +
               fVar201 * (float)bezier_basis0._6256_4_ +
               fVar164 * (float)bezier_basis0._8568_4_ + fVar197 * (float)bezier_basis0._7412_4_;
          auVar50._4_4_ =
               fVar55 * (float)bezier_basis0._5104_4_ +
               fVar206 * (float)bezier_basis0._6260_4_ +
               fVar178 * (float)bezier_basis0._8572_4_ + fVar118 * (float)bezier_basis0._7416_4_;
          auVar50._8_4_ =
               fVar69 * (float)bezier_basis0._5108_4_ +
               fVar208 * (float)bezier_basis0._6264_4_ +
               fVar179 * (float)bezier_basis0._8576_4_ + fVar128 * (float)bezier_basis0._7420_4_;
          auVar50._12_4_ =
               auVar38._12_4_ * (float)bezier_basis0._5112_4_ +
               auVar150._12_4_ * (float)bezier_basis0._6268_4_ +
               fVar190 * (float)bezier_basis0._8580_4_ + fVar129 * (float)bezier_basis0._7424_4_;
          auVar50._16_4_ =
               fVar72 * (float)bezier_basis0._5116_4_ +
               fVar201 * (float)bezier_basis0._6272_4_ +
               fVar164 * (float)bezier_basis0._8584_4_ + fVar197 * (float)bezier_basis0._7428_4_;
          auVar50._20_4_ =
               fVar55 * (float)bezier_basis0._5120_4_ +
               fVar206 * (float)bezier_basis0._6276_4_ +
               fVar178 * (float)bezier_basis0._8588_4_ + fVar118 * (float)bezier_basis0._7432_4_;
          auVar50._24_4_ =
               fVar69 * (float)bezier_basis0._5124_4_ +
               fVar208 * (float)bezier_basis0._6280_4_ +
               fVar179 * (float)bezier_basis0._8592_4_ + fVar128 * (float)bezier_basis0._7436_4_;
          auVar50._28_4_ = (float)bezier_basis0._5128_4_ + fVar199 + fVar218 + fVar190 + fVar129;
          auVar10 = vblendps_avx(auVar89,ZEXT832(0) << 0x20,1);
          auVar157 = vblendps_avx(auVar125,ZEXT832(0) << 0x20,1);
          auVar177 = ZEXT832(0) << 0x20;
          auVar185 = vblendps_avx(auVar50,auVar177,1);
          auVar17._4_4_ = auVar10._4_4_ * 0.055555556;
          auVar17._0_4_ = auVar10._0_4_ * 0.055555556;
          auVar17._8_4_ = auVar10._8_4_ * 0.055555556;
          auVar17._12_4_ = auVar10._12_4_ * 0.055555556;
          auVar17._16_4_ = auVar10._16_4_ * 0.055555556;
          auVar17._20_4_ = auVar10._20_4_ * 0.055555556;
          auVar17._24_4_ = auVar10._24_4_ * 0.055555556;
          auVar17._28_4_ = auVar10._28_4_;
          auVar18._4_4_ = auVar157._4_4_ * 0.055555556;
          auVar18._0_4_ = auVar157._0_4_ * 0.055555556;
          auVar18._8_4_ = auVar157._8_4_ * 0.055555556;
          auVar18._12_4_ = auVar157._12_4_ * 0.055555556;
          auVar18._16_4_ = auVar157._16_4_ * 0.055555556;
          auVar18._20_4_ = auVar157._20_4_ * 0.055555556;
          auVar18._24_4_ = auVar157._24_4_ * 0.055555556;
          auVar18._28_4_ = auVar157._28_4_;
          auVar19._4_4_ = auVar185._4_4_ * 0.055555556;
          auVar19._0_4_ = auVar185._0_4_ * 0.055555556;
          auVar19._8_4_ = auVar185._8_4_ * 0.055555556;
          auVar19._12_4_ = auVar185._12_4_ * 0.055555556;
          auVar19._16_4_ = auVar185._16_4_ * 0.055555556;
          auVar19._20_4_ = auVar185._20_4_ * 0.055555556;
          auVar19._24_4_ = auVar185._24_4_ * 0.055555556;
          auVar19._28_4_ = auVar185._28_4_;
          auVar97 = vsubps_avx(auVar226,auVar17);
          auVar14 = vsubps_avx(auVar117,auVar18);
          auVar46 = vsubps_avx(auVar68,auVar19);
          auVar10 = vblendps_avx(auVar89,auVar177,0x80);
          auVar157 = vblendps_avx(auVar125,auVar177,0x80);
          auVar185 = vblendps_avx(auVar50,auVar177,0x80);
          auVar90._0_4_ = auVar226._0_4_ + auVar10._0_4_ * 0.055555556;
          auVar90._4_4_ = auVar226._4_4_ + auVar10._4_4_ * 0.055555556;
          auVar90._8_4_ = auVar226._8_4_ + auVar10._8_4_ * 0.055555556;
          auVar90._12_4_ = auVar226._12_4_ + auVar10._12_4_ * 0.055555556;
          auVar90._16_4_ = auVar226._16_4_ + auVar10._16_4_ * 0.055555556;
          auVar90._20_4_ = auVar226._20_4_ + auVar10._20_4_ * 0.055555556;
          auVar90._24_4_ = auVar226._24_4_ + auVar10._24_4_ * 0.055555556;
          auVar90._28_4_ = auVar226._28_4_ + auVar10._28_4_;
          auVar126._0_4_ = auVar117._0_4_ + auVar157._0_4_ * 0.055555556;
          auVar126._4_4_ = auVar117._4_4_ + auVar157._4_4_ * 0.055555556;
          auVar126._8_4_ = auVar117._8_4_ + auVar157._8_4_ * 0.055555556;
          auVar126._12_4_ = auVar117._12_4_ + auVar157._12_4_ * 0.055555556;
          auVar126._16_4_ = auVar117._16_4_ + auVar157._16_4_ * 0.055555556;
          auVar126._20_4_ = auVar117._20_4_ + auVar157._20_4_ * 0.055555556;
          auVar126._24_4_ = auVar117._24_4_ + auVar157._24_4_ * 0.055555556;
          auVar126._28_4_ = auVar117._28_4_ + auVar157._28_4_;
          auVar51._0_4_ = auVar68._0_4_ + auVar185._0_4_ * 0.055555556;
          auVar51._4_4_ = auVar68._4_4_ + auVar185._4_4_ * 0.055555556;
          auVar51._8_4_ = auVar68._8_4_ + auVar185._8_4_ * 0.055555556;
          auVar51._12_4_ = auVar68._12_4_ + auVar185._12_4_ * 0.055555556;
          auVar51._16_4_ = auVar68._16_4_ + auVar185._16_4_ * 0.055555556;
          auVar51._20_4_ = auVar68._20_4_ + auVar185._20_4_ * 0.055555556;
          auVar51._24_4_ = auVar68._24_4_ + auVar185._24_4_ * 0.055555556;
          auVar51._28_4_ = auVar68._28_4_ + auVar185._28_4_;
          auVar99._8_4_ = 0x7f800000;
          auVar99._0_8_ = 0x7f8000007f800000;
          auVar99._12_4_ = 0x7f800000;
          auVar99._16_4_ = 0x7f800000;
          auVar99._20_4_ = 0x7f800000;
          auVar99._24_4_ = 0x7f800000;
          auVar99._28_4_ = 0x7f800000;
          auVar10 = vminps_avx(auVar99,auVar226);
          auVar157 = vminps_avx(auVar99,auVar117);
          auVar185 = vminps_avx(auVar99,auVar68);
          auVar177 = vminps_avx(auVar97,auVar90);
          auVar158 = vminps_avx(auVar10,auVar177);
          auVar10 = vminps_avx(auVar14,auVar126);
          auVar13 = vminps_avx(auVar157,auVar10);
          auVar10 = vminps_avx(auVar46,auVar51);
          auVar204 = vminps_avx(auVar185,auVar10);
          auVar10 = vmaxps_avx(auVar97,auVar90);
          auVar140._8_4_ = 0xff800000;
          auVar140._0_8_ = 0xff800000ff800000;
          auVar140._12_4_ = 0xff800000;
          auVar140._16_4_ = 0xff800000;
          auVar140._20_4_ = 0xff800000;
          auVar140._24_4_ = 0xff800000;
          auVar140._28_4_ = 0xff800000;
          auVar157 = vmaxps_avx(auVar140,auVar226);
          auVar10 = vmaxps_avx(auVar157,auVar10);
          auVar157 = vmaxps_avx(auVar14,auVar126);
          auVar149 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          auVar185 = vmaxps_avx(auVar140,auVar117);
          auVar157 = vmaxps_avx(auVar185,auVar157);
          auVar185 = vmaxps_avx(auVar46,auVar51);
          auVar160 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar177 = vmaxps_avx(auVar140,auVar68);
          auVar185 = vmaxps_avx(auVar177,auVar185);
          auVar177 = vshufps_avx(auVar158,auVar158,0xb1);
          auVar177 = vminps_avx(auVar158,auVar177);
          auVar158 = vshufpd_avx(auVar177,auVar177,5);
          auVar177 = vminps_avx(auVar177,auVar158);
          auVar57 = vminps_avx(auVar177._0_16_,auVar177._16_16_);
          auVar177 = vshufps_avx(auVar13,auVar13,0xb1);
          auVar177 = vminps_avx(auVar13,auVar177);
          auVar158 = vshufpd_avx(auVar177,auVar177,5);
          auVar177 = vminps_avx(auVar177,auVar158);
          auVar58 = vminps_avx(auVar177._0_16_,auVar177._16_16_);
          auVar58 = vunpcklps_avx(auVar57,auVar58);
          auVar177 = vshufps_avx(auVar204,auVar204,0xb1);
          auVar177 = vminps_avx(auVar204,auVar177);
          auVar158 = vshufpd_avx(auVar177,auVar177,5);
          auVar177 = vminps_avx(auVar177,auVar158);
          auVar57 = vminps_avx(auVar177._0_16_,auVar177._16_16_);
          auVar57 = vinsertps_avx(auVar58,auVar57,0x28);
          auVar58 = vminps_avx(auVar36,auVar57);
          auVar177 = vshufps_avx(auVar10,auVar10,0xb1);
          auVar10 = vmaxps_avx(auVar10,auVar177);
          auVar177 = vshufpd_avx(auVar10,auVar10,5);
          auVar10 = vmaxps_avx(auVar10,auVar177);
          auVar36 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
          auVar10 = vshufps_avx(auVar157,auVar157,0xb1);
          auVar10 = vmaxps_avx(auVar157,auVar10);
          auVar157 = vshufpd_avx(auVar10,auVar10,5);
          auVar10 = vmaxps_avx(auVar10,auVar157);
          auVar57 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
          auVar57 = vunpcklps_avx(auVar36,auVar57);
          auVar10 = vshufps_avx(auVar185,auVar185,0xb1);
          auVar10 = vmaxps_avx(auVar185,auVar10);
          auVar157 = vshufpd_avx(auVar10,auVar10,5);
          auVar10 = vmaxps_avx(auVar10,auVar157);
          auVar36 = vmaxps_avx(auVar10._0_16_,auVar10._16_16_);
          auVar36 = vinsertps_avx(auVar57,auVar36,0x28);
          auVar57 = vmaxps_avx(auVar73,auVar36);
          auVar96._8_4_ = 0x7fffffff;
          auVar96._0_8_ = 0x7fffffff7fffffff;
          auVar96._12_4_ = 0x7fffffff;
          auVar36 = vandps_avx(auVar58,auVar96);
          auVar73 = vandps_avx(auVar57,auVar96);
          auVar36 = vmaxps_avx(auVar36,auVar73);
          auVar73 = vmovshdup_avx(auVar36);
          auVar73 = vmaxss_avx(auVar73,auVar36);
          auVar36 = vshufpd_avx(auVar36,auVar36,1);
          auVar36 = vmaxss_avx(auVar36,auVar73);
          auVar36 = ZEXT416((uint)(auVar36._0_4_ * 4.7683716e-07));
          auVar36 = vshufps_avx(auVar36,auVar36,0);
          auVar73 = vsubps_avx(auVar58,auVar36);
          aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                   vinsertps_avx(auVar73,ZEXT416(geomID),0x30);
          auVar45._0_4_ = auVar57._0_4_ + auVar36._0_4_;
          auVar45._4_4_ = auVar57._4_4_ + auVar36._4_4_;
          auVar45._8_4_ = auVar57._8_4_ + auVar36._8_4_;
          auVar45._12_4_ = auVar57._12_4_ + auVar36._12_4_;
          aVar12 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                   vinsertps_avx(auVar45,ZEXT416((uint)uVar31),0x30);
          auVar84._0_4_ = aVar11.x + aVar12.x;
          auVar84._4_4_ = aVar11.y + aVar12.y;
          auVar84._8_4_ = aVar11.z + aVar12.z;
          auVar84._12_4_ = aVar11.field_3.w + aVar12.field_3.w;
          local_268 = vminps_avx(local_268,auVar84);
          local_258 = vmaxps_avx(local_258,auVar84);
          auVar36 = vmaxps_avx(auVar91._0_16_,(undefined1  [16])aVar12);
          auVar91 = ZEXT1664(auVar36);
          prims[local_270].upper.field_0.field_1 = aVar12;
          auVar36 = vminps_avx(auVar52._0_16_,(undefined1  [16])aVar11);
          auVar52 = ZEXT1664(auVar36);
          prims[local_270].lower.field_0.field_1 = aVar11;
          local_288 = local_288 + 1;
          local_270 = local_270 + 1;
        }
        else {
          auVar52 = ZEXT1664(auVar52._0_16_);
          auVar91 = ZEXT1664(auVar91._0_16_);
        }
      }
      auVar36 = auVar52._0_16_;
      auVar73 = auVar91._0_16_;
      uVar31 = uVar31 + 1;
    } while (uVar31 < r->_end);
  }
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
   m128 = auVar36;
  *(undefined1 (*) [16])
   (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
   m128 = auVar73;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_268._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = local_268._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_258._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = local_258._8_8_;
  __return_storage_ptr__->end = local_288;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }